

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNiIntersectorK<8,4>::
intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
          (CurveNiIntersectorK<8,4> *this,Precalculations *pre,RayHitK<4> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Vector *pVVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [12];
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  byte bVar56;
  long lVar57;
  byte bVar58;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  bool bVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  ulong uVar62;
  uint uVar63;
  uint uVar123;
  uint uVar124;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar125;
  uint uVar129;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float pp;
  float fVar130;
  undefined4 uVar131;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar132;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar145;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar146;
  float fVar147;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar157 [32];
  undefined1 auVar148 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar221 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [32];
  undefined4 uVar228;
  undefined4 uVar229;
  undefined1 auVar227 [64];
  undefined4 uVar231;
  undefined4 uVar232;
  undefined4 uVar233;
  undefined1 auVar230 [64];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_870 [16];
  int local_854;
  uint local_850;
  uint local_84c;
  float local_848;
  float local_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 *local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  Precalculations *local_7b0;
  int *local_7a8;
  undefined4 local_7a0;
  RayQueryContext *local_798;
  ulong local_790;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar52 = *(byte *)((long)&context->scene + 1);
  uVar54 = (ulong)bVar52;
  fVar6 = *(float *)((long)context + uVar54 * 0x19 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x20);
  auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[1].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x10);
  auVar72 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[1].vz.field_0.m128[(long)ray]),0x20);
  auVar207 = vsubps_avx(auVar66,*(undefined1 (*) [16])((long)context + uVar54 * 0x19 + 6));
  fVar194 = fVar6 * auVar207._0_4_;
  fVar130 = fVar6 * auVar72._0_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 4 + 6);
  auVar80 = vpmovsxbd_avx2(auVar66);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 5 + 6);
  auVar78 = vpmovsxbd_avx2(auVar67);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 6 + 6);
  auVar79 = vpmovsxbd_avx2(auVar64);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar68);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0xc + 6);
  auVar83 = vpmovsxbd_avx2(auVar69);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0xd + 6);
  auVar81 = vpmovsxbd_avx2(auVar70);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0x12 + 6);
  auVar84 = vpmovsxbd_avx2(auVar71);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0x13 + 6);
  auVar85 = vpmovsxbd_avx2(auVar65);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)((long)&context->scene + uVar54 * 0x14 + 6);
  auVar87 = vpmovsxbd_avx2(auVar73);
  auVar86 = vcvtdq2ps_avx(auVar87);
  auVar94._4_4_ = fVar130;
  auVar94._0_4_ = fVar130;
  auVar94._8_4_ = fVar130;
  auVar94._12_4_ = fVar130;
  auVar94._16_4_ = fVar130;
  auVar94._20_4_ = fVar130;
  auVar94._24_4_ = fVar130;
  auVar94._28_4_ = fVar130;
  auVar96._8_4_ = 1;
  auVar96._0_8_ = 0x100000001;
  auVar96._12_4_ = 1;
  auVar96._16_4_ = 1;
  auVar96._20_4_ = 1;
  auVar96._24_4_ = 1;
  auVar96._28_4_ = 1;
  auVar77 = ZEXT1632(CONCAT412(fVar6 * auVar72._12_4_,
                               CONCAT48(fVar6 * auVar72._8_4_,
                                        CONCAT44(fVar6 * auVar72._4_4_,fVar130))));
  auVar76 = vpermps_avx2(auVar96,auVar77);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar75 = vpermps_avx512vl(auVar74,auVar77);
  fVar130 = auVar75._0_4_;
  auVar222._0_4_ = fVar130 * auVar79._0_4_;
  fVar145 = auVar75._4_4_;
  auVar222._4_4_ = fVar145 * auVar79._4_4_;
  fVar146 = auVar75._8_4_;
  auVar222._8_4_ = fVar146 * auVar79._8_4_;
  fVar161 = auVar75._12_4_;
  auVar222._12_4_ = fVar161 * auVar79._12_4_;
  fVar163 = auVar75._16_4_;
  auVar222._16_4_ = fVar163 * auVar79._16_4_;
  fVar165 = auVar75._20_4_;
  auVar222._20_4_ = fVar165 * auVar79._20_4_;
  fVar132 = auVar75._24_4_;
  auVar222._28_36_ = in_ZMM4._28_36_;
  auVar222._24_4_ = fVar132 * auVar79._24_4_;
  auVar77._4_4_ = auVar81._4_4_ * fVar145;
  auVar77._0_4_ = auVar81._0_4_ * fVar130;
  auVar77._8_4_ = auVar81._8_4_ * fVar146;
  auVar77._12_4_ = auVar81._12_4_ * fVar161;
  auVar77._16_4_ = auVar81._16_4_ * fVar163;
  auVar77._20_4_ = auVar81._20_4_ * fVar165;
  auVar77._24_4_ = auVar81._24_4_ * fVar132;
  auVar77._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar86._4_4_ * fVar145;
  auVar87._0_4_ = auVar86._0_4_ * fVar130;
  auVar87._8_4_ = auVar86._8_4_ * fVar146;
  auVar87._12_4_ = auVar86._12_4_ * fVar161;
  auVar87._16_4_ = auVar86._16_4_ * fVar163;
  auVar87._20_4_ = auVar86._20_4_ * fVar165;
  auVar87._24_4_ = auVar86._24_4_ * fVar132;
  auVar87._28_4_ = auVar75._28_4_;
  auVar66 = vfmadd231ps_fma(auVar222._0_32_,auVar76,auVar78);
  auVar67 = vfmadd231ps_fma(auVar77,auVar76,auVar83);
  auVar64 = vfmadd231ps_fma(auVar87,auVar85,auVar76);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar94,auVar80);
  auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar94,auVar82);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar84,auVar94);
  auVar95._4_4_ = fVar194;
  auVar95._0_4_ = fVar194;
  auVar95._8_4_ = fVar194;
  auVar95._12_4_ = fVar194;
  auVar95._16_4_ = fVar194;
  auVar95._20_4_ = fVar194;
  auVar95._24_4_ = fVar194;
  auVar95._28_4_ = fVar194;
  auVar76 = ZEXT1632(CONCAT412(fVar6 * auVar207._12_4_,
                               CONCAT48(fVar6 * auVar207._8_4_,
                                        CONCAT44(fVar6 * auVar207._4_4_,fVar194))));
  auVar87 = vpermps_avx2(auVar96,auVar76);
  auVar76 = vpermps_avx512vl(auVar74,auVar76);
  auVar240 = ZEXT3264(auVar76);
  auVar77 = vmulps_avx512vl(auVar76,auVar79);
  auVar89._0_4_ = auVar76._0_4_ * auVar81._0_4_;
  auVar89._4_4_ = auVar76._4_4_ * auVar81._4_4_;
  auVar89._8_4_ = auVar76._8_4_ * auVar81._8_4_;
  auVar89._12_4_ = auVar76._12_4_ * auVar81._12_4_;
  auVar89._16_4_ = auVar76._16_4_ * auVar81._16_4_;
  auVar89._20_4_ = auVar76._20_4_ * auVar81._20_4_;
  auVar89._24_4_ = auVar76._24_4_ * auVar81._24_4_;
  auVar89._28_4_ = 0;
  auVar81._4_4_ = auVar76._4_4_ * auVar86._4_4_;
  auVar81._0_4_ = auVar76._0_4_ * auVar86._0_4_;
  auVar81._8_4_ = auVar76._8_4_ * auVar86._8_4_;
  auVar81._12_4_ = auVar76._12_4_ * auVar86._12_4_;
  auVar81._16_4_ = auVar76._16_4_ * auVar86._16_4_;
  auVar81._20_4_ = auVar76._20_4_ * auVar86._20_4_;
  auVar81._24_4_ = auVar76._24_4_ * auVar86._24_4_;
  auVar81._28_4_ = auVar79._28_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar78);
  auVar68 = vfmadd231ps_fma(auVar89,auVar87,auVar83);
  auVar69 = vfmadd231ps_fma(auVar81,auVar87,auVar85);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar95,auVar80);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar95,auVar82);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar95,auVar84);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar80 = vandps_avx(auVar93,ZEXT1632(auVar66));
  auVar91._8_4_ = 0x219392ef;
  auVar91._0_8_ = 0x219392ef219392ef;
  auVar91._12_4_ = 0x219392ef;
  auVar91._16_4_ = 0x219392ef;
  auVar91._20_4_ = 0x219392ef;
  auVar91._24_4_ = 0x219392ef;
  auVar91._28_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar80,auVar91,1);
  bVar59 = (bool)((byte)uVar55 & 1);
  auVar76._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._0_4_;
  bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._4_4_;
  bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._8_4_;
  bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar80 = vandps_avx(auVar93,ZEXT1632(auVar67));
  uVar55 = vcmpps_avx512vl(auVar80,auVar91,1);
  bVar59 = (bool)((byte)uVar55 & 1);
  auVar74._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar67._0_4_;
  bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar67._4_4_;
  bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar67._8_4_;
  bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar67._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar80 = vandps_avx(auVar93,ZEXT1632(auVar64));
  uVar55 = vcmpps_avx512vl(auVar80,auVar91,1);
  bVar59 = (bool)((byte)uVar55 & 1);
  auVar80._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._0_4_;
  bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._4_4_;
  bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._8_4_;
  bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar76);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  auVar92._16_4_ = 0x3f800000;
  auVar92._20_4_ = 0x3f800000;
  auVar92._24_4_ = 0x3f800000;
  auVar92._28_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar76,auVar79,auVar92);
  auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar74);
  auVar67 = vfnmadd213ps_fma(auVar74,auVar79,auVar92);
  auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar80);
  auVar64 = vfnmadd213ps_fma(auVar80,auVar79,auVar92);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar79,auVar79);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar54 * 7 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar78);
  auVar84._4_4_ = auVar66._4_4_ * auVar80._4_4_;
  auVar84._0_4_ = auVar66._0_4_ * auVar80._0_4_;
  auVar84._8_4_ = auVar66._8_4_ * auVar80._8_4_;
  auVar84._12_4_ = auVar66._12_4_ * auVar80._12_4_;
  auVar84._16_4_ = auVar80._16_4_ * 0.0;
  auVar84._20_4_ = auVar80._20_4_ * 0.0;
  auVar84._24_4_ = auVar80._24_4_ * 0.0;
  auVar84._28_4_ = auVar80._28_4_;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar54 * 9 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar78);
  auVar90._0_4_ = auVar66._0_4_ * auVar80._0_4_;
  auVar90._4_4_ = auVar66._4_4_ * auVar80._4_4_;
  auVar90._8_4_ = auVar66._8_4_ * auVar80._8_4_;
  auVar90._12_4_ = auVar66._12_4_ * auVar80._12_4_;
  auVar90._16_4_ = auVar80._16_4_ * 0.0;
  auVar90._20_4_ = auVar80._20_4_ * 0.0;
  auVar90._24_4_ = auVar80._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar54 * 0xe + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar68));
  auVar81 = vpbroadcastd_avx512vl();
  auVar78 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar52 * 0x10 + 6))
  ;
  auVar85._4_4_ = auVar67._4_4_ * auVar80._4_4_;
  auVar85._0_4_ = auVar67._0_4_ * auVar80._0_4_;
  auVar85._8_4_ = auVar67._8_4_ * auVar80._8_4_;
  auVar85._12_4_ = auVar67._12_4_ * auVar80._12_4_;
  auVar85._16_4_ = auVar80._16_4_ * 0.0;
  auVar85._20_4_ = auVar80._20_4_ * 0.0;
  auVar85._24_4_ = auVar80._24_4_ * 0.0;
  auVar85._28_4_ = auVar80._28_4_;
  auVar80 = vcvtdq2ps_avx(auVar78);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar68));
  auVar88._0_4_ = auVar67._0_4_ * auVar80._0_4_;
  auVar88._4_4_ = auVar67._4_4_ * auVar80._4_4_;
  auVar88._8_4_ = auVar67._8_4_ * auVar80._8_4_;
  auVar88._12_4_ = auVar67._12_4_ * auVar80._12_4_;
  auVar88._16_4_ = auVar80._16_4_ * 0.0;
  auVar88._20_4_ = auVar80._20_4_ * 0.0;
  auVar88._24_4_ = auVar80._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar54 * 0x15 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar69));
  auVar86._4_4_ = auVar80._4_4_ * auVar64._4_4_;
  auVar86._0_4_ = auVar80._0_4_ * auVar64._0_4_;
  auVar86._8_4_ = auVar80._8_4_ * auVar64._8_4_;
  auVar86._12_4_ = auVar80._12_4_ * auVar64._12_4_;
  auVar86._16_4_ = auVar80._16_4_ * 0.0;
  auVar86._20_4_ = auVar80._20_4_ * 0.0;
  auVar86._24_4_ = auVar80._24_4_ * 0.0;
  auVar86._28_4_ = auVar80._28_4_;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar54 * 0x17 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar69));
  auVar75._0_4_ = auVar64._0_4_ * auVar80._0_4_;
  auVar75._4_4_ = auVar64._4_4_ * auVar80._4_4_;
  auVar75._8_4_ = auVar64._8_4_ * auVar80._8_4_;
  auVar75._12_4_ = auVar64._12_4_ * auVar80._12_4_;
  auVar75._16_4_ = auVar80._16_4_ * 0.0;
  auVar75._20_4_ = auVar80._20_4_ * 0.0;
  auVar75._24_4_ = auVar80._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar80 = vpminsd_avx2(auVar84,auVar90);
  auVar78 = vpminsd_avx2(auVar85,auVar88);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar78 = vpminsd_avx2(auVar86,auVar75);
  uVar131 = *(undefined4 *)((long)&pre->ray_space[0].vz.field_0 + (long)ray * 4);
  auVar79._4_4_ = uVar131;
  auVar79._0_4_ = uVar131;
  auVar79._8_4_ = uVar131;
  auVar79._12_4_ = uVar131;
  auVar79._16_4_ = uVar131;
  auVar79._20_4_ = uVar131;
  auVar79._24_4_ = uVar131;
  auVar79._28_4_ = uVar131;
  auVar78 = vmaxps_avx512vl(auVar78,auVar79);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar78._8_4_ = 0x3f7ffffa;
  auVar78._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar78._12_4_ = 0x3f7ffffa;
  auVar78._16_4_ = 0x3f7ffffa;
  auVar78._20_4_ = 0x3f7ffffa;
  auVar78._24_4_ = 0x3f7ffffa;
  auVar78._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar80,auVar78);
  auVar80 = vpmaxsd_avx2(auVar84,auVar90);
  auVar78 = vpmaxsd_avx2(auVar85,auVar88);
  auVar222 = ZEXT3264(auVar93);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar78 = vpmaxsd_avx2(auVar86,auVar75);
  uVar131 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
  auVar82._4_4_ = uVar131;
  auVar82._0_4_ = uVar131;
  auVar82._8_4_ = uVar131;
  auVar82._12_4_ = uVar131;
  auVar82._16_4_ = uVar131;
  auVar82._20_4_ = uVar131;
  auVar82._24_4_ = uVar131;
  auVar82._28_4_ = uVar131;
  auVar78 = vminps_avx512vl(auVar78,auVar82);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar83);
  uVar16 = vcmpps_avx512vl(local_280,auVar80,2);
  uVar19 = vpcmpgtd_avx512vl(auVar81,_DAT_01fb4ba0);
  local_790 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar19));
  local_470 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_798 = context;
LAB_01a0878c:
  local_854 = 1;
  if (local_790 == 0) {
    return;
  }
  lVar57 = 0;
  for (uVar55 = local_790; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  fVar130 = *(float *)((long)&context->scene + 2);
  uVar54 = (ulong)(uint)fVar130;
  local_788 = (ulong)*(uint *)((long)&context->scene + lVar57 * 4 + 6);
  lVar57 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar54 * 8);
  uVar55 = (ulong)*(uint *)(*(long *)(lVar57 + 0x58) + local_788 * *(long *)(lVar57 + 0x68));
  auVar66 = *(undefined1 (*) [16])(*(long *)(lVar57 + 0x90) + *(long *)(lVar57 + 0xa0) * uVar55);
  auVar67 = *(undefined1 (*) [16])
             (*(long *)(lVar57 + 0x90) + *(long *)(lVar57 + 0xa0) * (uVar55 + 1));
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar68 = vinsertps_avx(auVar64,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x28);
  local_660 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vx.field_0.m128[(long)ray]));
  auVar241 = ZEXT3264(local_660);
  local_300 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]));
  auVar64 = vunpcklps_avx512vl(local_660._0_16_,local_300._0_16_);
  local_680 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vz.field_0.m128[(long)ray]));
  auVar242 = ZEXT3264(local_680);
  auVar73 = local_680._0_16_;
  local_690 = vinsertps_avx512f(auVar64,auVar73,0x28);
  auVar207._8_4_ = 0xbeaaaaab;
  auVar207._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar207._12_4_ = 0xbeaaaaab;
  auVar70 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (*(long *)(lVar57 + 0x100) + uVar55 * *(long *)(lVar57 + 0x110)),
                             auVar66,auVar207);
  auVar69 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (*(long *)(lVar57 + 0x100) + *(long *)(lVar57 + 0x110) * (uVar55 + 1)),
                            auVar67,auVar207);
  auVar208._0_4_ = auVar67._0_4_ + auVar66._0_4_ + auVar70._0_4_ + auVar69._0_4_;
  auVar208._4_4_ = auVar67._4_4_ + auVar66._4_4_ + auVar70._4_4_ + auVar69._4_4_;
  auVar208._8_4_ = auVar67._8_4_ + auVar66._8_4_ + auVar70._8_4_ + auVar69._8_4_;
  auVar208._12_4_ = auVar67._12_4_ + auVar66._12_4_ + auVar70._12_4_ + auVar69._12_4_;
  auVar72._8_4_ = 0x3e800000;
  auVar72._0_8_ = 0x3e8000003e800000;
  auVar72._12_4_ = 0x3e800000;
  auVar64 = vmulps_avx512vl(auVar208,auVar72);
  auVar64 = vsubps_avx(auVar64,auVar68);
  auVar64 = vdpps_avx(auVar64,local_690,0x7f);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  fVar6 = pre->ray_space[0].vz.field_0.m128[(long)ray];
  auVar215._4_12_ = ZEXT812(0) << 0x20;
  auVar215._0_4_ = local_6a0._0_4_;
  auVar65 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar215);
  auVar71 = vfnmadd213ss_fma(auVar65,local_6a0,ZEXT416(0x40000000));
  local_260 = auVar64._0_4_ * auVar65._0_4_ * auVar71._0_4_;
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar245 = ZEXT3264(auVar80);
  auVar216._4_4_ = local_260;
  auVar216._0_4_ = local_260;
  auVar216._8_4_ = local_260;
  auVar216._12_4_ = local_260;
  fStack_630 = local_260;
  _local_640 = auVar216;
  fStack_62c = local_260;
  fStack_628 = local_260;
  fStack_624 = local_260;
  auVar64 = vfmadd231ps_fma(auVar68,local_690,auVar216);
  auVar64 = vblendps_avx(auVar64,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar64);
  auVar68 = vsubps_avx(auVar69,auVar64);
  auVar69 = vsubps_avx(auVar70,auVar64);
  auVar67 = vsubps_avx(auVar67,auVar64);
  uVar131 = auVar66._0_4_;
  local_740._4_4_ = uVar131;
  local_740._0_4_ = uVar131;
  local_740._8_4_ = uVar131;
  local_740._12_4_ = uVar131;
  local_740._16_4_ = uVar131;
  local_740._20_4_ = uVar131;
  local_740._24_4_ = uVar131;
  local_740._28_4_ = uVar131;
  auVar230 = ZEXT3264(local_740);
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  local_540 = ZEXT1632(auVar66);
  local_760 = vpermps_avx512vl(auVar97,local_540);
  auVar243 = ZEXT3264(local_760);
  auVar98._8_4_ = 2;
  auVar98._0_8_ = 0x200000002;
  auVar98._12_4_ = 2;
  auVar98._16_4_ = 2;
  auVar98._20_4_ = 2;
  auVar98._24_4_ = 2;
  auVar98._28_4_ = 2;
  local_720 = vpermps_avx2(auVar98,local_540);
  auVar99._8_4_ = 3;
  auVar99._0_8_ = 0x300000003;
  auVar99._12_4_ = 3;
  auVar99._16_4_ = 3;
  auVar99._20_4_ = 3;
  auVar99._24_4_ = 3;
  auVar99._28_4_ = 3;
  local_780 = vpermps_avx2(auVar99,local_540);
  fVar145 = auVar69._0_4_;
  auVar237._4_4_ = fVar145;
  auVar237._0_4_ = fVar145;
  auVar237._8_4_ = fVar145;
  auVar237._12_4_ = fVar145;
  auVar237._16_4_ = fVar145;
  auVar237._20_4_ = fVar145;
  auVar237._24_4_ = fVar145;
  auVar237._28_4_ = fVar145;
  local_580 = ZEXT1632(auVar69);
  auVar80 = vpermps_avx512vl(auVar97,local_580);
  auVar78 = vpermps_avx512vl(auVar98,local_580);
  auVar79 = vpermps_avx512vl(auVar99,local_580);
  auVar82 = vbroadcastss_avx512vl(auVar68);
  local_560 = ZEXT1632(auVar68);
  auVar83 = vpermps_avx512vl(auVar97,local_560);
  auVar81 = vpermps_avx512vl(auVar98,local_560);
  auVar84 = vpermps_avx512vl(auVar99,local_560);
  auVar85 = vbroadcastss_avx512vl(auVar67);
  _local_5a0 = ZEXT1632(auVar67);
  auVar86 = vpermps_avx512vl(auVar97,_local_5a0);
  auVar87 = vpermps_avx512vl(auVar98,_local_5a0);
  auVar76 = vpermps_avx512vl(auVar99,_local_5a0);
  auVar225 = ZEXT3264(local_720);
  auVar66 = vmulss_avx512f(auVar73,auVar73);
  auVar77 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),local_300,local_300);
  auVar77 = vfmadd231ps_avx512vl(auVar77,local_660,local_660);
  uVar131 = auVar77._0_4_;
  local_220._4_4_ = uVar131;
  local_220._0_4_ = uVar131;
  local_220._8_4_ = uVar131;
  local_220._12_4_ = uVar131;
  local_220._16_4_ = uVar131;
  local_220._20_4_ = uVar131;
  local_220._24_4_ = uVar131;
  local_220._28_4_ = uVar131;
  local_240 = vandps_avx(auVar222._0_32_,local_220);
  auVar227 = ZEXT3264(local_780);
  local_5f0 = ZEXT416((uint)local_260);
  local_260 = fVar6 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_450 = vpbroadcastd_avx512vl();
  uVar55 = 0;
  local_460 = vpbroadcastd_avx512vl();
  auVar66 = vsqrtss_avx(local_6a0,local_6a0);
  local_844 = auVar66._0_4_;
  auVar66 = vsqrtss_avx(local_6a0,local_6a0);
  local_848 = auVar66._0_4_;
  local_330 = ZEXT816(0x3f80000000000000);
  do {
    auVar66 = vmovshdup_avx(local_330);
    auVar66 = vsubps_avx(auVar66,local_330);
    fVar146 = auVar66._0_4_;
    fVar132 = fVar146 * 0.04761905;
    local_800._0_4_ = local_330._0_4_;
    local_800._4_4_ = local_800._0_4_;
    fStack_7f8 = (float)local_800._0_4_;
    fStack_7f4 = (float)local_800._0_4_;
    register0x000012d0 = local_800._0_4_;
    register0x000012d4 = local_800._0_4_;
    register0x000012d8 = local_800._0_4_;
    register0x000012dc = local_800._0_4_;
    local_6c0._4_4_ = fVar146;
    local_6c0._0_4_ = fVar146;
    local_6c0._8_4_ = fVar146;
    local_6c0._12_4_ = fVar146;
    local_6c0._16_4_ = fVar146;
    local_6c0._20_4_ = fVar146;
    local_6c0._24_4_ = fVar146;
    local_6c0._28_4_ = fVar146;
    auVar66 = vfmadd231ps_fma(_local_800,local_6c0,_DAT_01f7b040);
    auVar244 = auVar245._0_32_;
    auVar77 = vsubps_avx512vl(auVar244,ZEXT1632(auVar66));
    fVar146 = auVar66._0_4_;
    fVar161 = auVar66._4_4_;
    auVar113._4_4_ = fVar145 * fVar161;
    auVar113._0_4_ = fVar145 * fVar146;
    fVar163 = auVar66._8_4_;
    auVar113._8_4_ = fVar145 * fVar163;
    fVar165 = auVar66._12_4_;
    auVar113._12_4_ = fVar145 * fVar165;
    auVar113._16_4_ = fVar145 * 0.0;
    auVar113._20_4_ = fVar145 * 0.0;
    auVar113._24_4_ = fVar145 * 0.0;
    auVar113._28_4_ = DAT_01f7b040._28_4_;
    auVar89 = ZEXT1632(auVar66);
    auVar74 = vmulps_avx512vl(auVar80,auVar89);
    auVar75 = vmulps_avx512vl(auVar78,auVar89);
    auVar88 = vmulps_avx512vl(auVar79,auVar89);
    auVar67 = vfmadd231ps_fma(auVar113,auVar77,auVar230._0_32_);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar77,auVar243._0_32_);
    auVar64 = vfmadd231ps_fma(auVar75,auVar77,auVar225._0_32_);
    auVar68 = vfmadd231ps_fma(auVar88,auVar77,auVar227._0_32_);
    auVar75 = vmulps_avx512vl(auVar82,auVar89);
    auVar94 = ZEXT1632(auVar66);
    auVar88 = vmulps_avx512vl(auVar83,auVar94);
    auVar89 = vmulps_avx512vl(auVar81,auVar94);
    auVar90 = vmulps_avx512vl(auVar84,auVar94);
    auVar69 = vfmadd231ps_fma(auVar75,auVar77,auVar237);
    auVar75 = vfmadd231ps_avx512vl(auVar88,auVar77,auVar80);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar77,auVar78);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar77,auVar79);
    auVar90 = vmulps_avx512vl(auVar85,auVar94);
    auVar91 = vmulps_avx512vl(auVar86,auVar94);
    auVar92 = vmulps_avx512vl(auVar87,auVar94);
    auVar93 = vmulps_avx512vl(auVar76,auVar94);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar77,auVar82);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar77,auVar83);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar77,auVar81);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar77,auVar84);
    auVar240._0_28_ =
         ZEXT1628(CONCAT412(fVar165 * auVar69._12_4_,
                            CONCAT48(fVar163 * auVar69._8_4_,
                                     CONCAT44(fVar161 * auVar69._4_4_,fVar146 * auVar69._0_4_))));
    auVar94 = vmulps_avx512vl(auVar94,auVar75);
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar66),auVar88);
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar66),auVar89);
    auVar66 = vfmadd231ps_fma(auVar240._0_32_,auVar77,ZEXT1632(auVar67));
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar77,auVar74);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar77,ZEXT1632(auVar64));
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar77,ZEXT1632(auVar68));
    auVar221._0_4_ = auVar90._0_4_ * fVar146;
    auVar221._4_4_ = auVar90._4_4_ * fVar161;
    auVar221._8_4_ = auVar90._8_4_ * fVar163;
    auVar221._12_4_ = auVar90._12_4_ * fVar165;
    auVar221._16_4_ = auVar90._16_4_ * 0.0;
    auVar221._20_4_ = auVar90._20_4_ * 0.0;
    auVar221._24_4_ = auVar90._24_4_ * 0.0;
    auVar221._28_4_ = 0;
    auVar105._4_4_ = auVar91._4_4_ * fVar161;
    auVar105._0_4_ = auVar91._0_4_ * fVar146;
    auVar105._8_4_ = auVar91._8_4_ * fVar163;
    auVar105._12_4_ = auVar91._12_4_ * fVar165;
    auVar105._16_4_ = auVar91._16_4_ * 0.0;
    auVar105._20_4_ = auVar91._20_4_ * 0.0;
    auVar105._24_4_ = auVar91._24_4_ * 0.0;
    auVar105._28_4_ = auVar90._28_4_;
    auVar106._4_4_ = auVar92._4_4_ * fVar161;
    auVar106._0_4_ = auVar92._0_4_ * fVar146;
    auVar106._8_4_ = auVar92._8_4_ * fVar163;
    auVar106._12_4_ = auVar92._12_4_ * fVar165;
    auVar106._16_4_ = auVar92._16_4_ * 0.0;
    auVar106._20_4_ = auVar92._20_4_ * 0.0;
    auVar106._24_4_ = auVar92._24_4_ * 0.0;
    auVar106._28_4_ = auVar91._28_4_;
    auVar107._4_4_ = auVar93._4_4_ * fVar161;
    auVar107._0_4_ = auVar93._0_4_ * fVar146;
    auVar107._8_4_ = auVar93._8_4_ * fVar163;
    auVar107._12_4_ = auVar93._12_4_ * fVar165;
    auVar107._16_4_ = auVar93._16_4_ * 0.0;
    auVar107._20_4_ = auVar93._20_4_ * 0.0;
    auVar107._24_4_ = auVar93._24_4_ * 0.0;
    auVar107._28_4_ = auVar92._28_4_;
    auVar67 = vfmadd231ps_fma(auVar221,auVar77,ZEXT1632(auVar69));
    auVar64 = vfmadd231ps_fma(auVar105,auVar77,auVar75);
    auVar68 = vfmadd231ps_fma(auVar106,auVar77,auVar88);
    auVar69 = vfmadd231ps_fma(auVar107,auVar77,auVar89);
    auVar206._28_4_ = auVar74._28_4_;
    auVar206._0_28_ =
         ZEXT1628(CONCAT412(auVar64._12_4_ * fVar165,
                            CONCAT48(auVar64._8_4_ * fVar163,
                                     CONCAT44(auVar64._4_4_ * fVar161,auVar64._0_4_ * fVar146))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar165 * auVar67._12_4_,
                                                 CONCAT48(fVar163 * auVar67._8_4_,
                                                          CONCAT44(fVar161 * auVar67._4_4_,
                                                                   fVar146 * auVar67._0_4_)))),
                              auVar77,ZEXT1632(auVar66));
    auVar90 = vfmadd231ps_avx512vl(auVar206,auVar77,auVar94);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar165,
                                            CONCAT48(auVar68._8_4_ * fVar163,
                                                     CONCAT44(auVar68._4_4_ * fVar161,
                                                              auVar68._0_4_ * fVar146)))),auVar77,
                         auVar95);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar165,
                                            CONCAT48(auVar69._8_4_ * fVar163,
                                                     CONCAT44(auVar69._4_4_ * fVar161,
                                                              auVar69._0_4_ * fVar146)))),auVar96,
                         auVar77);
    auVar77 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar66));
    auVar75 = vsubps_avx512vl(ZEXT1632(auVar64),auVar94);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar68),auVar95);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar69),auVar96);
    auVar234._0_4_ = fVar132 * auVar77._0_4_ * 3.0;
    auVar234._4_4_ = fVar132 * auVar77._4_4_ * 3.0;
    auVar234._8_4_ = fVar132 * auVar77._8_4_ * 3.0;
    auVar234._12_4_ = fVar132 * auVar77._12_4_ * 3.0;
    auVar234._16_4_ = fVar132 * auVar77._16_4_ * 3.0;
    auVar234._20_4_ = fVar132 * auVar77._20_4_ * 3.0;
    auVar234._24_4_ = fVar132 * auVar77._24_4_ * 3.0;
    auVar234._28_4_ = 0;
    auVar236._0_4_ = fVar132 * auVar75._0_4_ * 3.0;
    auVar236._4_4_ = fVar132 * auVar75._4_4_ * 3.0;
    auVar236._8_4_ = fVar132 * auVar75._8_4_ * 3.0;
    auVar236._12_4_ = fVar132 * auVar75._12_4_ * 3.0;
    auVar236._16_4_ = fVar132 * auVar75._16_4_ * 3.0;
    auVar236._20_4_ = fVar132 * auVar75._20_4_ * 3.0;
    auVar236._24_4_ = fVar132 * auVar75._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    auVar112._4_4_ = fVar132 * auVar88._4_4_ * 3.0;
    auVar112._0_4_ = fVar132 * auVar88._0_4_ * 3.0;
    auVar112._8_4_ = fVar132 * auVar88._8_4_ * 3.0;
    auVar112._12_4_ = fVar132 * auVar88._12_4_ * 3.0;
    auVar112._16_4_ = fVar132 * auVar88._16_4_ * 3.0;
    auVar112._20_4_ = fVar132 * auVar88._20_4_ * 3.0;
    auVar112._24_4_ = fVar132 * auVar88._24_4_ * 3.0;
    auVar112._28_4_ = auVar93._28_4_;
    fVar146 = auVar89._0_4_ * 3.0 * fVar132;
    fVar161 = auVar89._4_4_ * 3.0 * fVar132;
    auVar108._4_4_ = fVar161;
    auVar108._0_4_ = fVar146;
    fVar163 = auVar89._8_4_ * 3.0 * fVar132;
    auVar108._8_4_ = fVar163;
    fVar165 = auVar89._12_4_ * 3.0 * fVar132;
    auVar108._12_4_ = fVar165;
    fVar194 = auVar89._16_4_ * 3.0 * fVar132;
    auVar108._16_4_ = fVar194;
    fVar168 = auVar89._20_4_ * 3.0 * fVar132;
    auVar108._20_4_ = fVar168;
    fVar170 = auVar89._24_4_ * 3.0 * fVar132;
    auVar108._24_4_ = fVar170;
    auVar108._28_4_ = fVar132;
    auVar66 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar93 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar75 = ZEXT1632(auVar66);
    auVar94 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,auVar75);
    auVar212._0_4_ = auVar74._0_4_ + fVar146;
    auVar212._4_4_ = auVar74._4_4_ + fVar161;
    auVar212._8_4_ = auVar74._8_4_ + fVar163;
    auVar212._12_4_ = auVar74._12_4_ + fVar165;
    auVar212._16_4_ = auVar74._16_4_ + fVar194;
    auVar212._20_4_ = auVar74._20_4_ + fVar168;
    auVar212._24_4_ = auVar74._24_4_ + fVar170;
    auVar212._28_4_ = auVar74._28_4_ + fVar132;
    auVar77 = vmaxps_avx(auVar74,auVar212);
    auVar95 = vminps_avx512vl(auVar74,auVar212);
    auVar96 = vpermt2ps_avx512vl(auVar74,_DAT_01fb9fc0,auVar75);
    auVar97 = vpermt2ps_avx512vl(auVar234,_DAT_01fb9fc0,auVar75);
    auVar98 = vpermt2ps_avx512vl(auVar236,_DAT_01fb9fc0,auVar75);
    auVar113 = ZEXT1632(auVar66);
    auVar99 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,auVar113);
    auVar74 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar113);
    auVar74 = vsubps_avx(auVar96,auVar74);
    auVar75 = vsubps_avx(auVar92,ZEXT1632(auVar70));
    auVar88 = vsubps_avx(auVar93,auVar90);
    auVar89 = vsubps_avx(auVar94,auVar91);
    auVar100 = vmulps_avx512vl(auVar88,auVar112);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar236,auVar89);
    auVar101 = vmulps_avx512vl(auVar89,auVar234);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar112,auVar75);
    auVar102 = vmulps_avx512vl(auVar75,auVar236);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar234,auVar88);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar101 = vmulps_avx512vl(auVar89,auVar89);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar88,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar75,auVar75);
    auVar101 = vrcp14ps_avx512vl(auVar103);
    auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar103,auVar244);
    auVar101 = vfmadd132ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vmulps_avx512vl(auVar100,auVar101);
    auVar102 = vmulps_avx512vl(auVar88,auVar99);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar98,auVar89);
    auVar104 = vmulps_avx512vl(auVar89,auVar97);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar99,auVar75);
    auVar105 = vmulps_avx512vl(auVar75,auVar98);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar97,auVar88);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar102);
    auVar101 = vmulps_avx512vl(auVar102,auVar101);
    auVar100 = vmaxps_avx512vl(auVar100,auVar101);
    auVar100 = vsqrtps_avx512vl(auVar100);
    auVar101 = vmaxps_avx512vl(auVar74,auVar96);
    auVar77 = vmaxps_avx512vl(auVar77,auVar101);
    auVar104 = vaddps_avx512vl(auVar100,auVar77);
    auVar77 = vminps_avx(auVar74,auVar96);
    auVar77 = vminps_avx512vl(auVar95,auVar77);
    auVar77 = vsubps_avx512vl(auVar77,auVar100);
    auVar100._8_4_ = 0x3f800002;
    auVar100._0_8_ = 0x3f8000023f800002;
    auVar100._12_4_ = 0x3f800002;
    auVar100._16_4_ = 0x3f800002;
    auVar100._20_4_ = 0x3f800002;
    auVar100._24_4_ = 0x3f800002;
    auVar100._28_4_ = 0x3f800002;
    auVar74 = vmulps_avx512vl(auVar104,auVar100);
    auVar101._8_4_ = 0x3f7ffffc;
    auVar101._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar101._12_4_ = 0x3f7ffffc;
    auVar101._16_4_ = 0x3f7ffffc;
    auVar101._20_4_ = 0x3f7ffffc;
    auVar101._24_4_ = 0x3f7ffffc;
    auVar101._28_4_ = 0x3f7ffffc;
    local_820 = vmulps_avx512vl(auVar77,auVar101);
    auVar77 = vmulps_avx512vl(auVar74,auVar74);
    auVar74 = vrsqrt14ps_avx512vl(auVar103);
    auVar102._8_4_ = 0xbf000000;
    auVar102._0_8_ = 0xbf000000bf000000;
    auVar102._12_4_ = 0xbf000000;
    auVar102._16_4_ = 0xbf000000;
    auVar102._20_4_ = 0xbf000000;
    auVar102._24_4_ = 0xbf000000;
    auVar102._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar103,auVar102);
    fVar146 = auVar74._0_4_;
    fVar161 = auVar74._4_4_;
    fVar163 = auVar74._8_4_;
    fVar165 = auVar74._12_4_;
    fVar132 = auVar74._16_4_;
    fVar194 = auVar74._20_4_;
    fVar168 = auVar74._24_4_;
    auVar109._4_4_ = fVar161 * fVar161 * fVar161 * auVar95._4_4_;
    auVar109._0_4_ = fVar146 * fVar146 * fVar146 * auVar95._0_4_;
    auVar109._8_4_ = fVar163 * fVar163 * fVar163 * auVar95._8_4_;
    auVar109._12_4_ = fVar165 * fVar165 * fVar165 * auVar95._12_4_;
    auVar109._16_4_ = fVar132 * fVar132 * fVar132 * auVar95._16_4_;
    auVar109._20_4_ = fVar194 * fVar194 * fVar194 * auVar95._20_4_;
    auVar109._24_4_ = fVar168 * fVar168 * fVar168 * auVar95._24_4_;
    auVar109._28_4_ = auVar104._28_4_;
    auVar103._8_4_ = 0x3fc00000;
    auVar103._0_8_ = 0x3fc000003fc00000;
    auVar103._12_4_ = 0x3fc00000;
    auVar103._16_4_ = 0x3fc00000;
    auVar103._20_4_ = 0x3fc00000;
    auVar103._24_4_ = 0x3fc00000;
    auVar103._28_4_ = 0x3fc00000;
    auVar74 = vfmadd231ps_avx512vl(auVar109,auVar74,auVar103);
    auVar240 = ZEXT3264(auVar74);
    auVar95 = vmulps_avx512vl(auVar75,auVar74);
    auVar96 = vmulps_avx512vl(auVar88,auVar74);
    auVar100 = vmulps_avx512vl(auVar89,auVar74);
    auVar206 = ZEXT1632(auVar70);
    auVar101 = vsubps_avx512vl(auVar113,auVar206);
    auVar102 = vsubps_avx512vl(auVar113,auVar90);
    auVar103 = vsubps_avx512vl(auVar113,auVar91);
    auVar104 = vmulps_avx512vl(auVar242._0_32_,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_300,auVar102);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar241._0_32_,auVar101);
    auVar105 = vmulps_avx512vl(auVar103,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar102);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar106 = vmulps_avx512vl(auVar242._0_32_,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_300);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar95,auVar241._0_32_);
    auVar100 = vmulps_avx512vl(auVar103,auVar100);
    auVar96 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar96);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar95);
    auVar96 = vmulps_avx512vl(auVar106,auVar106);
    auVar100 = vsubps_avx512vl(local_220,auVar96);
    auVar107 = vmulps_avx512vl(auVar106,auVar95);
    auVar104 = vsubps_avx512vl(auVar104,auVar107);
    auVar107 = vaddps_avx512vl(auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar95,auVar95);
    local_840 = vsubps_avx512vl(auVar105,auVar104);
    auVar77 = vsubps_avx512vl(local_840,auVar77);
    local_6e0 = vmulps_avx512vl(auVar107,auVar107);
    auVar104._8_4_ = 0x40800000;
    auVar104._0_8_ = 0x4080000040800000;
    auVar104._12_4_ = 0x40800000;
    auVar104._16_4_ = 0x40800000;
    auVar104._20_4_ = 0x40800000;
    auVar104._24_4_ = 0x40800000;
    auVar104._28_4_ = 0x40800000;
    _local_4a0 = vmulps_avx512vl(auVar100,auVar104);
    auVar104 = vmulps_avx512vl(_local_4a0,auVar77);
    auVar104 = vsubps_avx512vl(local_6e0,auVar104);
    uVar62 = vcmpps_avx512vl(auVar104,auVar113,5);
    bVar52 = (byte)uVar62;
    fVar146 = (float)local_640._0_4_;
    fVar161 = (float)local_640._4_4_;
    fVar163 = fStack_638;
    fVar165 = fStack_634;
    fVar132 = fStack_630;
    fVar194 = fStack_62c;
    fVar168 = fStack_628;
    fVar170 = fStack_624;
    if (bVar52 == 0) {
      auVar222 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
LAB_01a0940b:
      auVar241 = ZEXT3264(local_660);
      auVar242 = ZEXT3264(local_680);
      auVar230 = ZEXT3264(local_740);
      auVar243 = ZEXT3264(local_760);
      auVar225 = ZEXT3264(local_720);
      auVar227 = ZEXT3264(local_780);
    }
    else {
      auVar104 = vsqrtps_avx512vl(auVar104);
      auVar105 = vaddps_avx512vl(auVar100,auVar100);
      local_520 = vrcp14ps_avx512vl(auVar105);
      auVar108 = vfnmadd213ps_avx512vl(local_520,auVar105,auVar244);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_520,local_520);
      auVar244._8_4_ = 0x80000000;
      auVar244._0_8_ = 0x8000000080000000;
      auVar244._12_4_ = 0x80000000;
      auVar244._16_4_ = 0x80000000;
      auVar244._20_4_ = 0x80000000;
      auVar244._24_4_ = 0x80000000;
      auVar244._28_4_ = 0x80000000;
      local_620 = vxorps_avx512vl(auVar107,auVar244);
      auVar109 = vsubps_avx512vl(local_620,auVar104);
      local_4c0 = vmulps_avx512vl(auVar109,auVar108);
      auVar104 = vsubps_avx512vl(auVar104,auVar107);
      local_700 = vmulps_avx512vl(auVar104,auVar108);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar104,local_4c0);
      auVar110._0_4_ =
           (uint)(bVar52 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar104._0_4_;
      bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar59 * auVar108._4_4_ | (uint)!bVar59 * auVar104._4_4_;
      bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar59 * auVar108._8_4_ | (uint)!bVar59 * auVar104._8_4_;
      bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar59 * auVar108._12_4_ | (uint)!bVar59 * auVar104._12_4_;
      bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar59 * auVar108._16_4_ | (uint)!bVar59 * auVar104._16_4_;
      bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar59 * auVar108._20_4_ | (uint)!bVar59 * auVar104._20_4_;
      bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar59 * auVar108._24_4_ | (uint)!bVar59 * auVar104._24_4_;
      bVar59 = SUB81(uVar62 >> 7,0);
      auVar110._28_4_ = (uint)bVar59 * auVar108._28_4_ | (uint)!bVar59 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar104,local_700);
      auVar111._0_4_ =
           (uint)(bVar52 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar104._0_4_;
      bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar59 * auVar108._4_4_ | (uint)!bVar59 * auVar104._4_4_;
      bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar59 * auVar108._8_4_ | (uint)!bVar59 * auVar104._8_4_;
      bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar59 * auVar108._12_4_ | (uint)!bVar59 * auVar104._12_4_;
      bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar59 * auVar108._16_4_ | (uint)!bVar59 * auVar104._16_4_;
      bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar59 * auVar108._20_4_ | (uint)!bVar59 * auVar104._20_4_;
      bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar59 * auVar108._24_4_ | (uint)!bVar59 * auVar104._24_4_;
      bVar59 = SUB81(uVar62 >> 7,0);
      auVar111._28_4_ = (uint)bVar59 * auVar108._28_4_ | (uint)!bVar59 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar104);
      local_4e0 = vmaxps_avx512vl(local_240,auVar104);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_500 = vmulps_avx512vl(local_4e0,auVar30);
      vandps_avx512vl(auVar100,auVar104);
      uVar17 = vcmpps_avx512vl(local_500,local_500,1);
      uVar62 = uVar62 & uVar17;
      bVar58 = (byte)uVar62;
      if (bVar58 != 0) {
        uVar17 = vcmpps_avx512vl(auVar77,_DAT_01f7b000,2);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar100 = vblendmps_avx512vl(auVar77,auVar96);
        bVar56 = (byte)uVar17;
        uVar63 = (uint)(bVar56 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar56 & 1) * local_500._0_4_;
        bVar59 = (bool)((byte)(uVar17 >> 1) & 1);
        uVar123 = (uint)bVar59 * auVar100._4_4_ | (uint)!bVar59 * local_500._4_4_;
        bVar59 = (bool)((byte)(uVar17 >> 2) & 1);
        uVar124 = (uint)bVar59 * auVar100._8_4_ | (uint)!bVar59 * local_500._8_4_;
        bVar59 = (bool)((byte)(uVar17 >> 3) & 1);
        uVar125 = (uint)bVar59 * auVar100._12_4_ | (uint)!bVar59 * local_500._12_4_;
        bVar59 = (bool)((byte)(uVar17 >> 4) & 1);
        uVar126 = (uint)bVar59 * auVar100._16_4_ | (uint)!bVar59 * local_500._16_4_;
        bVar59 = (bool)((byte)(uVar17 >> 5) & 1);
        uVar127 = (uint)bVar59 * auVar100._20_4_ | (uint)!bVar59 * local_500._20_4_;
        bVar59 = (bool)((byte)(uVar17 >> 6) & 1);
        uVar128 = (uint)bVar59 * auVar100._24_4_ | (uint)!bVar59 * local_500._24_4_;
        bVar59 = SUB81(uVar17 >> 7,0);
        uVar129 = (uint)bVar59 * auVar100._28_4_ | (uint)!bVar59 * local_500._28_4_;
        auVar110._0_4_ = (bVar58 & 1) * uVar63 | !(bool)(bVar58 & 1) * auVar110._0_4_;
        bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar110._4_4_ = bVar59 * uVar123 | !bVar59 * auVar110._4_4_;
        bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar110._8_4_ = bVar59 * uVar124 | !bVar59 * auVar110._8_4_;
        bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar110._12_4_ = bVar59 * uVar125 | !bVar59 * auVar110._12_4_;
        bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar110._16_4_ = bVar59 * uVar126 | !bVar59 * auVar110._16_4_;
        bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar110._20_4_ = bVar59 * uVar127 | !bVar59 * auVar110._20_4_;
        bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar110._24_4_ = bVar59 * uVar128 | !bVar59 * auVar110._24_4_;
        bVar59 = SUB81(uVar62 >> 7,0);
        auVar110._28_4_ = bVar59 * uVar129 | !bVar59 * auVar110._28_4_;
        auVar77 = vblendmps_avx512vl(auVar96,auVar77);
        bVar59 = (bool)((byte)(uVar17 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar111._0_4_ =
             (uint)(bVar58 & 1) *
             ((uint)(bVar56 & 1) * auVar77._0_4_ | !(bool)(bVar56 & 1) * uVar63) |
             !(bool)(bVar58 & 1) * auVar111._0_4_;
        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar111._4_4_ =
             (uint)bVar9 * ((uint)bVar59 * auVar77._4_4_ | !bVar59 * uVar123) |
             !bVar9 * auVar111._4_4_;
        bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar111._8_4_ =
             (uint)bVar59 * ((uint)bVar10 * auVar77._8_4_ | !bVar10 * uVar124) |
             !bVar59 * auVar111._8_4_;
        bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar111._12_4_ =
             (uint)bVar59 * ((uint)bVar11 * auVar77._12_4_ | !bVar11 * uVar125) |
             !bVar59 * auVar111._12_4_;
        bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar111._16_4_ =
             (uint)bVar59 * ((uint)bVar12 * auVar77._16_4_ | !bVar12 * uVar126) |
             !bVar59 * auVar111._16_4_;
        bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar111._20_4_ =
             (uint)bVar59 * ((uint)bVar13 * auVar77._20_4_ | !bVar13 * uVar127) |
             !bVar59 * auVar111._20_4_;
        bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar111._24_4_ =
             (uint)bVar59 * ((uint)bVar14 * auVar77._24_4_ | !bVar14 * uVar128) |
             !bVar59 * auVar111._24_4_;
        bVar59 = SUB81(uVar62 >> 7,0);
        auVar111._28_4_ =
             (uint)bVar59 * ((uint)bVar15 * auVar77._28_4_ | !bVar15 * uVar129) |
             !bVar59 * auVar111._28_4_;
        bVar52 = (~bVar58 | bVar56) & bVar52;
      }
      if ((bVar52 & 0x7f) == 0) {
        auVar222 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar245 = ZEXT3264(auVar77);
        goto LAB_01a0940b;
      }
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar96 = vxorps_avx512vl(auVar99,auVar77);
      auVar97 = vxorps_avx512vl(auVar97,auVar77);
      uVar63 = *(uint *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
      auVar245 = ZEXT464(uVar63);
      auVar98 = vxorps_avx512vl(auVar98,auVar77);
      auVar66 = vsubss_avx512f(ZEXT416(uVar63),ZEXT416((uint)local_5f0._0_4_));
      auVar99 = vbroadcastss_avx512vl(auVar66);
      auVar99 = vminps_avx512vl(auVar99,auVar111);
      auVar51._4_4_ = fStack_25c;
      auVar51._0_4_ = local_260;
      auVar51._8_4_ = fStack_258;
      auVar51._12_4_ = fStack_254;
      auVar51._16_4_ = fStack_250;
      auVar51._20_4_ = fStack_24c;
      auVar51._24_4_ = fStack_248;
      auVar51._28_4_ = fStack_244;
      auVar100 = vmaxps_avx512vl(auVar51,auVar110);
      auVar103 = vmulps_avx512vl(auVar103,auVar112);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar236,auVar103);
      auVar66 = vfmadd213ps_fma(auVar101,auVar234,auVar102);
      auVar101 = vmulps_avx512vl(local_680,auVar112);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_300,auVar236);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_660,auVar234);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar101,auVar102);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar102,auVar103,1);
      auVar104 = vxorps_avx512vl(ZEXT1632(auVar66),auVar77);
      auVar112 = vrcp14ps_avx512vl(auVar101);
      auVar108 = vxorps_avx512vl(auVar101,auVar77);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar113 = vfnmadd213ps_avx512vl(auVar112,auVar101,auVar109);
      auVar66 = vfmadd132ps_fma(auVar113,auVar112,auVar112);
      fVar147 = auVar66._0_4_ * auVar104._0_4_;
      fVar162 = auVar66._4_4_ * auVar104._4_4_;
      auVar36._4_4_ = fVar162;
      auVar36._0_4_ = fVar147;
      fVar164 = auVar66._8_4_ * auVar104._8_4_;
      auVar36._8_4_ = fVar164;
      fVar166 = auVar66._12_4_ * auVar104._12_4_;
      auVar36._12_4_ = fVar166;
      fVar167 = auVar104._16_4_ * 0.0;
      auVar36._16_4_ = fVar167;
      fVar169 = auVar104._20_4_ * 0.0;
      auVar36._20_4_ = fVar169;
      fVar171 = auVar104._24_4_ * 0.0;
      auVar36._24_4_ = fVar171;
      auVar36._28_4_ = auVar104._28_4_;
      uVar19 = vcmpps_avx512vl(auVar101,auVar108,1);
      bVar58 = (byte)uVar16 | (byte)uVar19;
      auVar238._8_4_ = 0xff800000;
      auVar238._0_8_ = 0xff800000ff800000;
      auVar238._12_4_ = 0xff800000;
      auVar238._16_4_ = 0xff800000;
      auVar238._20_4_ = 0xff800000;
      auVar238._24_4_ = 0xff800000;
      auVar238._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar36,auVar238);
      auVar114._0_4_ =
           (uint)(bVar58 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar112._0_4_;
      bVar59 = (bool)(bVar58 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar59 * auVar113._4_4_ | (uint)!bVar59 * auVar112._4_4_;
      bVar59 = (bool)(bVar58 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar59 * auVar113._8_4_ | (uint)!bVar59 * auVar112._8_4_;
      bVar59 = (bool)(bVar58 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar59 * auVar113._12_4_ | (uint)!bVar59 * auVar112._12_4_;
      bVar59 = (bool)(bVar58 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar59 * auVar113._16_4_ | (uint)!bVar59 * auVar112._16_4_;
      bVar59 = (bool)(bVar58 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar59 * auVar113._20_4_ | (uint)!bVar59 * auVar112._20_4_;
      bVar59 = (bool)(bVar58 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar59 * auVar113._24_4_ | (uint)!bVar59 * auVar112._24_4_;
      auVar114._28_4_ =
           (uint)(bVar58 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar112._28_4_;
      auVar100 = vmaxps_avx512vl(auVar100,auVar114);
      uVar19 = vcmpps_avx512vl(auVar101,auVar108,6);
      bVar58 = (byte)uVar16 | (byte)uVar19;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115._0_4_ =
           (uint)(bVar58 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)fVar147;
      bVar59 = (bool)(bVar58 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar59 * auVar101._4_4_ | (uint)!bVar59 * (int)fVar162;
      bVar59 = (bool)(bVar58 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar59 * auVar101._8_4_ | (uint)!bVar59 * (int)fVar164;
      bVar59 = (bool)(bVar58 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar59 * auVar101._12_4_ | (uint)!bVar59 * (int)fVar166;
      bVar59 = (bool)(bVar58 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar59 * auVar101._16_4_ | (uint)!bVar59 * (int)fVar167;
      bVar59 = (bool)(bVar58 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar59 * auVar101._20_4_ | (uint)!bVar59 * (int)fVar169;
      bVar59 = (bool)(bVar58 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar59 * auVar101._24_4_ | (uint)!bVar59 * (int)fVar171;
      auVar115._28_4_ =
           (uint)(bVar58 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar104._28_4_;
      auVar104 = vminps_avx512vl(auVar99,auVar115);
      auVar66 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar66),auVar92);
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar66),auVar93);
      auVar99 = ZEXT1632(auVar66);
      auVar94 = vsubps_avx512vl(auVar99,auVar94);
      auVar94 = vmulps_avx512vl(auVar94,auVar96);
      auVar93 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar93);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar92);
      auVar93 = vmulps_avx512vl(local_680,auVar96);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_300,auVar98);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_660,auVar97);
      vandps_avx512vl(auVar93,auVar102);
      uVar16 = vcmpps_avx512vl(auVar93,auVar103,1);
      auVar92 = vxorps_avx512vl(auVar92,auVar77);
      auVar94 = vrcp14ps_avx512vl(auVar93);
      auVar77 = vxorps_avx512vl(auVar93,auVar77);
      auVar96 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar109);
      auVar66 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
      fVar147 = auVar66._0_4_ * auVar92._0_4_;
      fVar162 = auVar66._4_4_ * auVar92._4_4_;
      auVar37._4_4_ = fVar162;
      auVar37._0_4_ = fVar147;
      fVar164 = auVar66._8_4_ * auVar92._8_4_;
      auVar37._8_4_ = fVar164;
      fVar166 = auVar66._12_4_ * auVar92._12_4_;
      auVar37._12_4_ = fVar166;
      fVar167 = auVar92._16_4_ * 0.0;
      auVar37._16_4_ = fVar167;
      fVar169 = auVar92._20_4_ * 0.0;
      auVar37._20_4_ = fVar169;
      fVar171 = auVar92._24_4_ * 0.0;
      auVar37._24_4_ = fVar171;
      auVar37._28_4_ = auVar92._28_4_;
      uVar19 = vcmpps_avx512vl(auVar93,auVar77,1);
      bVar58 = (byte)uVar16 | (byte)uVar19;
      auVar96 = vblendmps_avx512vl(auVar37,auVar238);
      auVar116._0_4_ =
           (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
      bVar59 = (bool)(bVar58 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar59 * auVar96._4_4_ | (uint)!bVar59 * auVar94._4_4_;
      bVar59 = (bool)(bVar58 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar59 * auVar96._8_4_ | (uint)!bVar59 * auVar94._8_4_;
      bVar59 = (bool)(bVar58 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar59 * auVar96._12_4_ | (uint)!bVar59 * auVar94._12_4_;
      bVar59 = (bool)(bVar58 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar59 * auVar96._16_4_ | (uint)!bVar59 * auVar94._16_4_;
      bVar59 = (bool)(bVar58 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar59 * auVar96._20_4_ | (uint)!bVar59 * auVar94._20_4_;
      bVar59 = (bool)(bVar58 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar59 * auVar96._24_4_ | (uint)!bVar59 * auVar94._24_4_;
      auVar116._28_4_ =
           (uint)(bVar58 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar94._28_4_;
      local_3a0 = vmaxps_avx(auVar100,auVar116);
      uVar19 = vcmpps_avx512vl(auVar93,auVar77,6);
      bVar58 = (byte)uVar16 | (byte)uVar19;
      auVar117._0_4_ =
           (uint)(bVar58 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)fVar147;
      bVar59 = (bool)(bVar58 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar59 * auVar101._4_4_ | (uint)!bVar59 * (int)fVar162;
      bVar59 = (bool)(bVar58 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar59 * auVar101._8_4_ | (uint)!bVar59 * (int)fVar164;
      bVar59 = (bool)(bVar58 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar59 * auVar101._12_4_ | (uint)!bVar59 * (int)fVar166;
      bVar59 = (bool)(bVar58 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar59 * auVar101._16_4_ | (uint)!bVar59 * (int)fVar167;
      bVar59 = (bool)(bVar58 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar59 * auVar101._20_4_ | (uint)!bVar59 * (int)fVar169;
      bVar59 = (bool)(bVar58 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar59 * auVar101._24_4_ | (uint)!bVar59 * (int)fVar171;
      auVar117._28_4_ =
           (uint)(bVar58 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar92._28_4_;
      local_2c0 = vminps_avx(auVar104,auVar117);
      uVar16 = vcmpps_avx512vl(local_3a0,local_2c0,2);
      bVar52 = bVar52 & 0x7f & (byte)uVar16;
      if (bVar52 == 0) {
        auVar222 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar245 = ZEXT3264(auVar109);
        goto LAB_01a0940b;
      }
      auVar92 = vmaxps_avx512vl(auVar99,local_820);
      auVar77 = vfmadd213ps_avx512vl(local_4c0,auVar106,auVar95);
      fVar147 = auVar74._0_4_;
      fVar162 = auVar74._4_4_;
      auVar38._4_4_ = fVar162 * auVar77._4_4_;
      auVar38._0_4_ = fVar147 * auVar77._0_4_;
      fVar164 = auVar74._8_4_;
      auVar38._8_4_ = fVar164 * auVar77._8_4_;
      fVar166 = auVar74._12_4_;
      auVar38._12_4_ = fVar166 * auVar77._12_4_;
      fVar167 = auVar74._16_4_;
      auVar38._16_4_ = fVar167 * auVar77._16_4_;
      fVar169 = auVar74._20_4_;
      auVar38._20_4_ = fVar169 * auVar77._20_4_;
      fVar171 = auVar74._24_4_;
      auVar38._24_4_ = fVar171 * auVar77._24_4_;
      auVar38._28_4_ = auVar77._28_4_;
      auVar77 = vfmadd213ps_avx512vl(local_700,auVar106,auVar95);
      auVar39._4_4_ = fVar162 * auVar77._4_4_;
      auVar39._0_4_ = fVar147 * auVar77._0_4_;
      auVar39._8_4_ = fVar164 * auVar77._8_4_;
      auVar39._12_4_ = fVar166 * auVar77._12_4_;
      auVar39._16_4_ = fVar167 * auVar77._16_4_;
      auVar39._20_4_ = fVar169 * auVar77._20_4_;
      auVar39._24_4_ = fVar171 * auVar77._24_4_;
      auVar39._28_4_ = auVar77._28_4_;
      auVar77 = vminps_avx512vl(auVar38,auVar109);
      auVar45 = ZEXT812(0);
      auVar93 = ZEXT1232(auVar45) << 0x20;
      auVar77 = vmaxps_avx(auVar77,ZEXT1232(auVar45) << 0x20);
      auVar94 = vminps_avx512vl(auVar39,auVar109);
      auVar40._4_4_ = (auVar77._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar77._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar77._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar77._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar77._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar77._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar77._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar77._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar40,local_6c0,_local_800);
      auVar77 = vmaxps_avx(auVar94,ZEXT1232(auVar45) << 0x20);
      auVar41._4_4_ = (auVar77._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar77._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar77._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar77._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar77._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar77._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar77._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar77._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar41,local_6c0,_local_800);
      auVar42._4_4_ = auVar92._4_4_ * auVar92._4_4_;
      auVar42._0_4_ = auVar92._0_4_ * auVar92._0_4_;
      auVar42._8_4_ = auVar92._8_4_ * auVar92._8_4_;
      auVar42._12_4_ = auVar92._12_4_ * auVar92._12_4_;
      auVar42._16_4_ = auVar92._16_4_ * auVar92._16_4_;
      auVar42._20_4_ = auVar92._20_4_ * auVar92._20_4_;
      auVar42._24_4_ = auVar92._24_4_ * auVar92._24_4_;
      auVar42._28_4_ = auVar92._28_4_;
      auVar77 = vsubps_avx(local_840,auVar42);
      auVar43._4_4_ = auVar77._4_4_ * (float)local_4a0._4_4_;
      auVar43._0_4_ = auVar77._0_4_ * (float)local_4a0._0_4_;
      auVar43._8_4_ = auVar77._8_4_ * fStack_498;
      auVar43._12_4_ = auVar77._12_4_ * fStack_494;
      auVar43._16_4_ = auVar77._16_4_ * fStack_490;
      auVar43._20_4_ = auVar77._20_4_ * fStack_48c;
      auVar43._24_4_ = auVar77._24_4_ * fStack_488;
      auVar43._28_4_ = auVar92._28_4_;
      auVar92 = vsubps_avx(local_6e0,auVar43);
      uVar16 = vcmpps_avx512vl(auVar92,ZEXT1232(auVar45) << 0x20,5);
      bVar58 = (byte)uVar16;
      if (bVar58 == 0) {
        bVar58 = 0;
        auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar75 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar92 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar118._8_4_ = 0x7f800000;
        auVar118._0_8_ = 0x7f8000007f800000;
        auVar118._12_4_ = 0x7f800000;
        auVar118._16_4_ = 0x7f800000;
        auVar118._20_4_ = 0x7f800000;
        auVar118._24_4_ = 0x7f800000;
        auVar118._28_4_ = 0x7f800000;
        auVar119._8_4_ = 0xff800000;
        auVar119._0_8_ = 0xff800000ff800000;
        auVar119._12_4_ = 0xff800000;
        auVar119._16_4_ = 0xff800000;
        auVar119._20_4_ = 0xff800000;
        auVar119._24_4_ = 0xff800000;
        auVar119._28_4_ = 0xff800000;
      }
      else {
        auVar67 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
        uVar62 = vcmpps_avx512vl(auVar92,auVar99,5);
        auVar92 = vsqrtps_avx(auVar92);
        auVar93 = vfnmadd213ps_avx512vl(auVar105,local_520,auVar109);
        auVar96 = vfmadd132ps_avx512vl(auVar93,local_520,local_520);
        auVar93 = vsubps_avx(local_620,auVar92);
        auVar97 = vmulps_avx512vl(auVar93,auVar96);
        auVar92 = vsubps_avx512vl(auVar92,auVar107);
        auVar98 = vmulps_avx512vl(auVar92,auVar96);
        auVar92 = vfmadd213ps_avx512vl(auVar106,auVar97,auVar95);
        auVar44._4_4_ = fVar162 * auVar92._4_4_;
        auVar44._0_4_ = fVar147 * auVar92._0_4_;
        auVar44._8_4_ = fVar164 * auVar92._8_4_;
        auVar44._12_4_ = fVar166 * auVar92._12_4_;
        auVar44._16_4_ = fVar167 * auVar92._16_4_;
        auVar44._20_4_ = fVar169 * auVar92._20_4_;
        auVar44._24_4_ = fVar171 * auVar92._24_4_;
        auVar44._28_4_ = auVar94._28_4_;
        auVar92 = vmulps_avx512vl(local_660,auVar97);
        auVar93 = vmulps_avx512vl(local_300,auVar97);
        auVar99 = vmulps_avx512vl(local_680,auVar97);
        auVar94 = vfmadd213ps_avx512vl(auVar75,auVar44,auVar206);
        auVar94 = vsubps_avx512vl(auVar92,auVar94);
        auVar92 = vfmadd213ps_avx512vl(auVar88,auVar44,auVar90);
        auVar96 = vsubps_avx512vl(auVar93,auVar92);
        auVar66 = vfmadd213ps_fma(auVar44,auVar89,auVar91);
        auVar92 = vsubps_avx(auVar99,ZEXT1632(auVar66));
        auVar93 = vfmadd213ps_avx512vl(auVar106,auVar98,auVar95);
        auVar95 = vmulps_avx512vl(auVar74,auVar93);
        auVar240 = ZEXT3264(auVar95);
        auVar74 = vmulps_avx512vl(local_660,auVar98);
        auVar99 = vmulps_avx512vl(local_300,auVar98);
        auVar100 = vmulps_avx512vl(local_680,auVar98);
        auVar66 = vfmadd213ps_fma(auVar75,auVar95,auVar206);
        auVar93 = vsubps_avx(auVar74,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar88,auVar95,auVar90);
        auVar74 = vsubps_avx512vl(auVar99,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar89,auVar95,auVar91);
        auVar75 = vsubps_avx512vl(auVar100,ZEXT1632(auVar66));
        auVar190._8_4_ = 0x7f800000;
        auVar190._0_8_ = 0x7f8000007f800000;
        auVar190._12_4_ = 0x7f800000;
        auVar190._16_4_ = 0x7f800000;
        auVar190._20_4_ = 0x7f800000;
        auVar190._24_4_ = 0x7f800000;
        auVar190._28_4_ = 0x7f800000;
        auVar88 = vblendmps_avx512vl(auVar190,auVar97);
        bVar59 = (bool)((byte)uVar62 & 1);
        auVar118._0_4_ = (uint)bVar59 * auVar88._0_4_ | (uint)!bVar59 * auVar70._0_4_;
        bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar59 * auVar88._4_4_ | (uint)!bVar59 * auVar70._4_4_;
        bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar59 * auVar88._8_4_ | (uint)!bVar59 * auVar70._8_4_;
        bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar59 * auVar88._12_4_ | (uint)!bVar59 * auVar70._12_4_;
        iVar1 = (uint)((byte)(uVar62 >> 4) & 1) * auVar88._16_4_;
        auVar118._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar62 >> 5) & 1) * auVar88._20_4_;
        auVar118._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar62 >> 6) & 1) * auVar88._24_4_;
        auVar118._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar62 >> 7) * auVar88._28_4_;
        auVar118._28_4_ = iVar4;
        auVar191._8_4_ = 0xff800000;
        auVar191._0_8_ = 0xff800000ff800000;
        auVar191._12_4_ = 0xff800000;
        auVar191._16_4_ = 0xff800000;
        auVar191._20_4_ = 0xff800000;
        auVar191._24_4_ = 0xff800000;
        auVar191._28_4_ = 0xff800000;
        auVar88 = vblendmps_avx512vl(auVar191,auVar98);
        bVar59 = (bool)((byte)uVar62 & 1);
        auVar119._0_4_ = (uint)bVar59 * auVar88._0_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar59 * auVar88._4_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar59 * auVar88._8_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar59 * auVar88._12_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar119._16_4_ = (uint)bVar59 * auVar88._16_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar119._20_4_ = (uint)bVar59 * auVar88._20_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar119._24_4_ = (uint)bVar59 * auVar88._24_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = SUB81(uVar62 >> 7,0);
        auVar119._28_4_ = (uint)bVar59 * auVar88._28_4_ | (uint)!bVar59 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(local_4e0,auVar31);
        uVar17 = vcmpps_avx512vl(auVar88,local_500,0xe);
        uVar62 = uVar62 & uVar17;
        bVar56 = (byte)uVar62;
        if (bVar56 != 0) {
          uVar17 = vcmpps_avx512vl(auVar77,ZEXT1632(auVar67),2);
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar235._8_4_ = 0xff800000;
          auVar235._0_8_ = 0xff800000ff800000;
          auVar235._12_4_ = 0xff800000;
          auVar235._16_4_ = 0xff800000;
          auVar235._20_4_ = 0xff800000;
          auVar235._24_4_ = 0xff800000;
          auVar235._28_4_ = 0xff800000;
          auVar77 = vblendmps_avx512vl(auVar226,auVar235);
          bVar53 = (byte)uVar17;
          uVar63 = (uint)(bVar53 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar88._0_4_;
          bVar59 = (bool)((byte)(uVar17 >> 1) & 1);
          uVar123 = (uint)bVar59 * auVar77._4_4_ | (uint)!bVar59 * auVar88._4_4_;
          bVar59 = (bool)((byte)(uVar17 >> 2) & 1);
          uVar124 = (uint)bVar59 * auVar77._8_4_ | (uint)!bVar59 * auVar88._8_4_;
          bVar59 = (bool)((byte)(uVar17 >> 3) & 1);
          uVar125 = (uint)bVar59 * auVar77._12_4_ | (uint)!bVar59 * auVar88._12_4_;
          bVar59 = (bool)((byte)(uVar17 >> 4) & 1);
          uVar126 = (uint)bVar59 * auVar77._16_4_ | (uint)!bVar59 * auVar88._16_4_;
          bVar59 = (bool)((byte)(uVar17 >> 5) & 1);
          uVar127 = (uint)bVar59 * auVar77._20_4_ | (uint)!bVar59 * auVar88._20_4_;
          bVar59 = (bool)((byte)(uVar17 >> 6) & 1);
          uVar128 = (uint)bVar59 * auVar77._24_4_ | (uint)!bVar59 * auVar88._24_4_;
          bVar59 = SUB81(uVar17 >> 7,0);
          uVar129 = (uint)bVar59 * auVar77._28_4_ | (uint)!bVar59 * auVar88._28_4_;
          auVar118._0_4_ = (bVar56 & 1) * uVar63 | !(bool)(bVar56 & 1) * auVar118._0_4_;
          bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar118._4_4_ = bVar59 * uVar123 | !bVar59 * auVar118._4_4_;
          bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar118._8_4_ = bVar59 * uVar124 | !bVar59 * auVar118._8_4_;
          bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar118._12_4_ = bVar59 * uVar125 | !bVar59 * auVar118._12_4_;
          bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar118._16_4_ = bVar59 * uVar126 | (uint)!bVar59 * iVar1;
          bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar118._20_4_ = bVar59 * uVar127 | (uint)!bVar59 * iVar2;
          bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar118._24_4_ = bVar59 * uVar128 | (uint)!bVar59 * iVar3;
          bVar59 = SUB81(uVar62 >> 7,0);
          auVar118._28_4_ = bVar59 * uVar129 | (uint)!bVar59 * iVar4;
          auVar77 = vblendmps_avx512vl(auVar235,auVar226);
          bVar59 = (bool)((byte)(uVar17 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          bVar15 = SUB81(uVar17 >> 7,0);
          auVar119._0_4_ =
               (uint)(bVar56 & 1) *
               ((uint)(bVar53 & 1) * auVar77._0_4_ | !(bool)(bVar53 & 1) * uVar63) |
               !(bool)(bVar56 & 1) * auVar119._0_4_;
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar119._4_4_ =
               (uint)bVar9 * ((uint)bVar59 * auVar77._4_4_ | !bVar59 * uVar123) |
               !bVar9 * auVar119._4_4_;
          bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar119._8_4_ =
               (uint)bVar59 * ((uint)bVar10 * auVar77._8_4_ | !bVar10 * uVar124) |
               !bVar59 * auVar119._8_4_;
          bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar119._12_4_ =
               (uint)bVar59 * ((uint)bVar11 * auVar77._12_4_ | !bVar11 * uVar125) |
               !bVar59 * auVar119._12_4_;
          bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar119._16_4_ =
               (uint)bVar59 * ((uint)bVar12 * auVar77._16_4_ | !bVar12 * uVar126) |
               !bVar59 * auVar119._16_4_;
          bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar119._20_4_ =
               (uint)bVar59 * ((uint)bVar13 * auVar77._20_4_ | !bVar13 * uVar127) |
               !bVar59 * auVar119._20_4_;
          bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar119._24_4_ =
               (uint)bVar59 * ((uint)bVar14 * auVar77._24_4_ | !bVar14 * uVar128) |
               !bVar59 * auVar119._24_4_;
          bVar59 = SUB81(uVar62 >> 7,0);
          auVar119._28_4_ =
               (uint)bVar59 * ((uint)bVar15 * auVar77._28_4_ | !bVar15 * uVar129) |
               !bVar59 * auVar119._28_4_;
          bVar58 = (~bVar56 | bVar53) & bVar58;
        }
      }
      auVar242 = ZEXT3264(local_680);
      auVar77 = vmulps_avx512vl(local_680,auVar75);
      auVar77 = vfmadd231ps_avx512vl(auVar77,local_300,auVar74);
      auVar241 = ZEXT3264(local_660);
      auVar77 = vfmadd231ps_avx512vl(auVar77,local_660,auVar93);
      _local_200 = local_3a0;
      local_1e0 = vminps_avx(local_2c0,auVar118);
      auVar223._8_4_ = 0x7fffffff;
      auVar223._0_8_ = 0x7fffffff7fffffff;
      auVar223._12_4_ = 0x7fffffff;
      auVar223._16_4_ = 0x7fffffff;
      auVar223._20_4_ = 0x7fffffff;
      auVar223._24_4_ = 0x7fffffff;
      auVar223._28_4_ = 0x7fffffff;
      auVar77 = vandps_avx(auVar77,auVar223);
      auVar222 = ZEXT3264(auVar223);
      _local_2e0 = vmaxps_avx(local_3a0,auVar119);
      auVar224._8_4_ = 0x3e99999a;
      auVar224._0_8_ = 0x3e99999a3e99999a;
      auVar224._12_4_ = 0x3e99999a;
      auVar224._16_4_ = 0x3e99999a;
      auVar224._20_4_ = 0x3e99999a;
      auVar224._24_4_ = 0x3e99999a;
      auVar224._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar77,auVar224,1);
      uVar19 = vcmpps_avx512vl(local_3a0,local_1e0,2);
      bVar56 = (byte)uVar19 & bVar52;
      uVar18 = vcmpps_avx512vl(_local_2e0,local_2c0,2);
      if ((bVar52 & ((byte)uVar18 | (byte)uVar19)) == 0) {
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar245 = ZEXT3264(auVar77);
        auVar230 = ZEXT3264(local_740);
        auVar243 = ZEXT3264(local_760);
        auVar225 = ZEXT3264(local_720);
        auVar227 = ZEXT3264(local_780);
      }
      else {
        _local_380 = _local_2e0;
        local_850 = (uint)(byte)((byte)uVar16 | ~bVar58);
        auVar77 = vmulps_avx512vl(local_680,auVar92);
        auVar66 = vfmadd213ps_fma(auVar96,local_300,auVar77);
        auVar77 = vfmadd213ps_avx512vl(auVar94,local_660,ZEXT1632(auVar66));
        auVar77 = vandps_avx(auVar77,auVar223);
        uVar16 = vcmpps_avx512vl(auVar77,auVar224,1);
        bVar58 = (byte)uVar16 | ~bVar58;
        auVar140._8_4_ = 2;
        auVar140._0_8_ = 0x200000002;
        auVar140._12_4_ = 2;
        auVar140._16_4_ = 2;
        auVar140._20_4_ = 2;
        auVar140._24_4_ = 2;
        auVar140._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar140,auVar32);
        local_2a0._0_4_ = (uint)(bVar58 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
        bVar59 = (bool)(bVar58 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar59 * auVar77._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar58 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar59 * auVar77._8_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar58 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar59 * auVar77._12_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar58 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar59 * auVar77._16_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar58 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar59 * auVar77._20_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar58 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar59 * auVar77._24_4_ | (uint)!bVar59 * 2;
        local_2a0._28_4_ = (uint)(bVar58 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_320,local_2a0,5);
        local_84c = (uint)bVar56;
        local_360 = local_3a0._0_4_ + (float)local_640._0_4_;
        fStack_35c = local_3a0._4_4_ + (float)local_640._4_4_;
        fStack_358 = local_3a0._8_4_ + fStack_638;
        fStack_354 = local_3a0._12_4_ + fStack_634;
        fStack_350 = local_3a0._16_4_ + fStack_630;
        fStack_34c = local_3a0._20_4_ + fStack_62c;
        fStack_348 = local_3a0._24_4_ + fStack_628;
        fStack_344 = local_3a0._28_4_ + fStack_624;
        for (bVar56 = (byte)uVar16 & bVar56; auVar77 = _local_800, bVar56 != 0;
            bVar56 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar56 & (byte)uVar16) {
          auVar141._8_4_ = 0x7f800000;
          auVar141._0_8_ = 0x7f8000007f800000;
          auVar141._12_4_ = 0x7f800000;
          auVar141._16_4_ = 0x7f800000;
          auVar141._20_4_ = 0x7f800000;
          auVar141._24_4_ = 0x7f800000;
          auVar141._28_4_ = 0x7f800000;
          auVar74 = vblendmps_avx512vl(auVar141,local_3a0);
          auVar121._0_4_ =
               (uint)(bVar56 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar56 >> 6 & 1);
          auVar121._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 0x7f800000;
          auVar121._28_4_ =
               (uint)(bVar56 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar56 >> 7) * 0x7f800000;
          auVar74 = vshufps_avx(auVar121,auVar121,0xb1);
          auVar74 = vminps_avx(auVar121,auVar74);
          auVar75 = vshufpd_avx(auVar74,auVar74,5);
          auVar74 = vminps_avx(auVar74,auVar75);
          auVar75 = vpermpd_avx2(auVar74,0x4e);
          auVar74 = vminps_avx(auVar74,auVar75);
          uVar16 = vcmpps_avx512vl(auVar121,auVar74,0);
          bVar53 = (byte)uVar16 & bVar56;
          bVar58 = bVar56;
          if (bVar53 != 0) {
            bVar58 = bVar53;
          }
          iVar2 = 0;
          for (uVar63 = (uint)bVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          fVar163 = local_848;
          fVar161 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
          uVar131 = 0;
          uVar228 = 0;
          uVar229 = 0;
          fVar146 = *(float *)(local_200 + (uint)(iVar2 << 2));
          uVar231 = 0;
          uVar232 = 0;
          uVar233 = 0;
          if ((float)local_6a0._0_4_ < 0.0) {
            local_840._0_16_ = ZEXT416((uint)*(float *)(local_1a0 + (uint)(iVar2 << 2)));
            local_6e0._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar2 << 2)));
            local_800[1] = 0;
            local_800[0] = bVar56;
            stack0xfffffffffffff802 = auVar77._2_30_;
            auVar240 = ZEXT1664(auVar240._0_16_);
            fVar163 = sqrtf((float)local_6a0._0_4_);
            bVar56 = local_800[0];
            fVar161 = (float)local_840._0_4_;
            uVar131 = local_840._4_4_;
            uVar228 = local_840._8_4_;
            uVar229 = local_840._12_4_;
            fVar146 = (float)local_6e0._0_4_;
            uVar231 = local_6e0._4_4_;
            uVar232 = local_6e0._8_4_;
            uVar233 = local_6e0._12_4_;
          }
          auVar67 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar66 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar64 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vminps_avx(auVar67,auVar64);
          auVar67 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar64 = vmaxps_avx(auVar66,auVar67);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar68,auVar195);
          auVar67 = vandps_avx(auVar64,auVar195);
          auVar66 = vmaxps_avx(auVar66,auVar67);
          auVar67 = vmovshdup_avx(auVar66);
          auVar67 = vmaxss_avx(auVar67,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar67);
          fVar165 = auVar66._0_4_ * 1.9073486e-06;
          local_5e0 = vshufps_avx(auVar64,auVar64,0xff);
          lVar57 = 5;
          do {
            do {
              auVar74 = local_6e0;
              auVar77 = local_840;
              bVar59 = lVar57 == 0;
              lVar57 = lVar57 + -1;
              if (bVar59) goto LAB_01a09fd6;
              auVar133._4_4_ = fVar146;
              auVar133._0_4_ = fVar146;
              auVar133._8_4_ = fVar146;
              auVar133._12_4_ = fVar146;
              auVar67 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_690);
              fVar132 = 1.0 - fVar161;
              auVar172._0_4_ = local_580._0_4_ * fVar161;
              auVar172._4_4_ = local_580._4_4_ * fVar161;
              auVar172._8_4_ = local_580._8_4_ * fVar161;
              auVar172._12_4_ = local_580._12_4_ * fVar161;
              local_4c0._0_16_ = ZEXT416((uint)fVar132);
              auVar196._4_4_ = fVar132;
              auVar196._0_4_ = fVar132;
              auVar196._8_4_ = fVar132;
              auVar196._12_4_ = fVar132;
              auVar66 = vfmadd231ps_fma(auVar172,auVar196,local_540._0_16_);
              auVar200._0_4_ = local_560._0_4_ * fVar161;
              auVar200._4_4_ = local_560._4_4_ * fVar161;
              auVar200._8_4_ = local_560._8_4_ * fVar161;
              auVar200._12_4_ = local_560._12_4_ * fVar161;
              auVar64 = vfmadd231ps_fma(auVar200,auVar196,local_580._0_16_);
              auVar209._0_4_ = fVar161 * (float)local_5a0._0_4_;
              auVar209._4_4_ = fVar161 * (float)local_5a0._4_4_;
              auVar209._8_4_ = fVar161 * fStack_598;
              auVar209._12_4_ = fVar161 * fStack_594;
              auVar68 = vfmadd231ps_fma(auVar209,auVar196,local_560._0_16_);
              auVar217._0_4_ = fVar161 * auVar64._0_4_;
              auVar217._4_4_ = fVar161 * auVar64._4_4_;
              auVar217._8_4_ = fVar161 * auVar64._8_4_;
              auVar217._12_4_ = fVar161 * auVar64._12_4_;
              auVar66 = vfmadd231ps_fma(auVar217,auVar196,auVar66);
              auVar173._0_4_ = fVar161 * auVar68._0_4_;
              auVar173._4_4_ = fVar161 * auVar68._4_4_;
              auVar173._8_4_ = fVar161 * auVar68._8_4_;
              auVar173._12_4_ = fVar161 * auVar68._12_4_;
              auVar64 = vfmadd231ps_fma(auVar173,auVar196,auVar64);
              auVar201._0_4_ = fVar161 * auVar64._0_4_;
              auVar201._4_4_ = fVar161 * auVar64._4_4_;
              auVar201._8_4_ = fVar161 * auVar64._8_4_;
              auVar201._12_4_ = fVar161 * auVar64._12_4_;
              auVar68 = vfmadd231ps_fma(auVar201,auVar66,auVar196);
              auVar66 = vsubps_avx(auVar64,auVar66);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar66,auVar20);
              _local_4a0 = auVar68;
              auVar67 = vsubps_avx(auVar67,auVar68);
              auVar66 = vdpps_avx(auVar67,auVar67,0x7f);
              local_840._4_4_ = uVar131;
              local_840._0_4_ = fVar161;
              local_840._8_4_ = uVar228;
              local_840._16_16_ = auVar77._16_16_;
              local_840._12_4_ = uVar229;
              local_6e0._4_4_ = uVar231;
              local_6e0._0_4_ = fVar146;
              local_6e0._8_4_ = uVar232;
              local_6e0._16_16_ = auVar74._16_16_;
              local_6e0._12_4_ = uVar233;
              _local_800 = auVar64;
              local_6c0._0_16_ = auVar67;
              local_820._0_16_ = auVar66;
              if (auVar66._0_4_ < 0.0) {
                auVar227._0_4_ = sqrtf(auVar66._0_4_);
                auVar227._4_60_ = extraout_var;
                auVar66 = auVar227._0_16_;
                auVar64 = _local_800;
              }
              else {
                auVar66 = vsqrtss_avx(auVar66,auVar66);
              }
              local_4e0._0_16_ = vdpps_avx(auVar64,auVar64,0x7f);
              fVar146 = local_4e0._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar146;
              local_700._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              fVar161 = local_700._0_4_;
              local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_4e0._0_16_,auVar21);
              auVar67 = vfnmadd213ss_fma(local_500._0_16_,local_4e0._0_16_,ZEXT416(0x40000000));
              local_520._0_4_ = auVar67._0_4_;
              local_620._0_4_ = auVar66._0_4_;
              if (fVar146 < auVar68._0_4_) {
                auVar230._0_4_ = sqrtf(fVar146);
                auVar230._4_60_ = extraout_var_00;
                auVar66 = ZEXT416((uint)local_620._0_4_);
                auVar67 = auVar230._0_16_;
                auVar64 = _local_800;
              }
              else {
                auVar67 = vsqrtss_avx512f(local_4e0._0_16_,local_4e0._0_16_);
              }
              fVar132 = local_700._0_4_;
              fVar146 = fVar161 * 1.5 + fVar146 * -0.5 * fVar132 * fVar132 * fVar132;
              auVar218._0_4_ = auVar64._0_4_ * fVar146;
              auVar218._4_4_ = auVar64._4_4_ * fVar146;
              auVar218._8_4_ = auVar64._8_4_ * fVar146;
              auVar218._12_4_ = auVar64._12_4_ * fVar146;
              local_700._0_16_ = vdpps_avx(local_6c0._0_16_,auVar218,0x7f);
              fVar132 = auVar66._0_4_;
              auVar134._0_4_ = local_700._0_4_ * local_700._0_4_;
              auVar134._4_4_ = local_700._4_4_ * local_700._4_4_;
              auVar134._8_4_ = local_700._8_4_ * local_700._8_4_;
              auVar134._12_4_ = local_700._12_4_ * local_700._12_4_;
              auVar68 = vsubps_avx(local_820._0_16_,auVar134);
              fVar161 = auVar68._0_4_;
              auVar149._4_12_ = ZEXT812(0) << 0x20;
              auVar149._0_4_ = fVar161;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar149);
              auVar70 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar71 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
              if (fVar161 < 0.0) {
                local_5d0 = fVar146;
                fStack_5cc = fVar146;
                fStack_5c8 = fVar146;
                fStack_5c4 = fVar146;
                local_5c0 = auVar218;
                local_5b0 = auVar69;
                fVar194 = sqrtf(fVar161);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar67 = ZEXT416(auVar67._0_4_);
                auVar66 = ZEXT416((uint)local_620._0_4_);
                auVar218 = local_5c0;
                auVar64 = _local_800;
                auVar69 = local_5b0;
                fVar146 = local_5d0;
                fVar161 = fStack_5cc;
                fVar168 = fStack_5c8;
                fVar170 = fStack_5c4;
              }
              else {
                auVar68 = vsqrtss_avx(auVar68,auVar68);
                fVar194 = auVar68._0_4_;
                fVar161 = fVar146;
                fVar168 = fVar146;
                fVar170 = fVar146;
              }
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,
                                        local_4c0._0_16_);
              fVar147 = auVar68._0_4_ * 6.0;
              fVar162 = local_840._0_4_ * 6.0;
              auVar175._0_4_ = fVar162 * (float)local_5a0._0_4_;
              auVar175._4_4_ = fVar162 * (float)local_5a0._4_4_;
              auVar175._8_4_ = fVar162 * fStack_598;
              auVar175._12_4_ = fVar162 * fStack_594;
              auVar150._4_4_ = fVar147;
              auVar150._0_4_ = fVar147;
              auVar150._8_4_ = fVar147;
              auVar150._12_4_ = fVar147;
              auVar68 = vfmadd132ps_fma(auVar150,auVar175,local_560._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,
                                        local_840._0_16_);
              fVar147 = auVar65._0_4_ * 6.0;
              auVar176._4_4_ = fVar147;
              auVar176._0_4_ = fVar147;
              auVar176._8_4_ = fVar147;
              auVar176._12_4_ = fVar147;
              auVar68 = vfmadd132ps_fma(auVar176,auVar68,local_580._0_16_);
              fVar147 = local_4c0._0_4_ * 6.0;
              auVar151._4_4_ = fVar147;
              auVar151._0_4_ = fVar147;
              auVar151._8_4_ = fVar147;
              auVar151._12_4_ = fVar147;
              auVar68 = vfmadd132ps_fma(auVar151,auVar68,local_540._0_16_);
              auVar177._0_4_ = auVar68._0_4_ * (float)local_4e0._0_4_;
              auVar177._4_4_ = auVar68._4_4_ * (float)local_4e0._0_4_;
              auVar177._8_4_ = auVar68._8_4_ * (float)local_4e0._0_4_;
              auVar177._12_4_ = auVar68._12_4_ * (float)local_4e0._0_4_;
              auVar68 = vdpps_avx(auVar64,auVar68,0x7f);
              fVar147 = auVar68._0_4_;
              auVar152._0_4_ = auVar64._0_4_ * fVar147;
              auVar152._4_4_ = auVar64._4_4_ * fVar147;
              auVar152._8_4_ = auVar64._8_4_ * fVar147;
              auVar152._12_4_ = auVar64._12_4_ * fVar147;
              auVar68 = vsubps_avx(auVar177,auVar152);
              fVar147 = (float)local_520._0_4_ * (float)local_500._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar64,auVar22);
              auVar202._0_4_ = fVar146 * auVar68._0_4_ * fVar147;
              auVar202._4_4_ = fVar161 * auVar68._4_4_ * fVar147;
              auVar202._8_4_ = fVar168 * auVar68._8_4_ * fVar147;
              auVar202._12_4_ = fVar170 * auVar68._12_4_ * fVar147;
              auVar68 = vdpps_avx(auVar72,auVar218,0x7f);
              auVar240 = ZEXT1664(auVar218);
              auVar65 = vmaxss_avx(ZEXT416((uint)fVar165),
                                   ZEXT416((uint)((float)local_6e0._0_4_ * fVar163 * 1.9073486e-06))
                                  );
              auVar73 = vdivss_avx512f(ZEXT416((uint)fVar165),auVar67);
              auVar67 = vdpps_avx(local_6c0._0_16_,auVar202,0x7f);
              auVar66 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar165),auVar65);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar132 + 1.0)),auVar73,auVar66);
              auVar66 = vdpps_avx(local_690,auVar218,0x7f);
              fVar146 = auVar68._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_6c0._0_16_,auVar72,0x7f);
              auVar71 = vmulss_avx512f(auVar71,auVar69);
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar68 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              auVar69 = vaddss_avx512f(auVar70,ZEXT416((uint)(auVar71._0_4_ * auVar69._0_4_)));
              auVar70 = vfnmadd231ss_avx512f(auVar67,local_700._0_16_,ZEXT416((uint)fVar146));
              auVar71 = vfnmadd231ss_avx512f(auVar68,local_700._0_16_,auVar66);
              auVar67 = vpermilps_avx(_local_4a0,0xff);
              fVar194 = fVar194 - auVar67._0_4_;
              auVar67 = vshufps_avx(auVar64,auVar64,0xff);
              auVar68 = vfmsub213ss_fma(auVar70,auVar69,auVar67);
              fVar161 = auVar71._0_4_ * auVar69._0_4_;
              auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar68._0_4_)),
                                        ZEXT416((uint)fVar146),ZEXT416((uint)fVar161));
              fVar132 = auVar69._0_4_;
              auVar219._0_4_ = fVar161 / fVar132;
              auVar219._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar210._0_4_ = auVar68._0_4_ / fVar132;
              auVar210._4_12_ = auVar68._4_12_;
              auVar68 = vmulss_avx512f(local_700._0_16_,auVar219);
              auVar69 = vmulss_avx512f(local_700._0_16_,auVar210);
              fVar161 = local_840._0_4_ - (auVar68._0_4_ - fVar194 * (auVar66._0_4_ / fVar132));
              uVar131 = 0;
              uVar228 = 0;
              uVar229 = 0;
              fVar146 = (float)local_6e0._0_4_ - (fVar194 * (fVar146 / fVar132) - auVar69._0_4_);
              uVar231 = 0;
              uVar232 = 0;
              uVar233 = 0;
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar66 = vandps_avx512vl(local_700._0_16_,auVar23);
            } while (auVar73._0_4_ <= auVar66._0_4_);
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ + auVar65._0_4_)),local_5e0,
                                      ZEXT416(0x36000000));
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar68 = vandps_avx512vl(ZEXT416((uint)fVar194),auVar24);
          } while (auVar66._0_4_ <= auVar68._0_4_);
          fVar146 = fVar146 + (float)local_5f0._0_4_;
          if ((((fVar6 <= fVar146) &&
               (fVar163 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar146 <= fVar163)) &&
              (0.0 <= fVar161)) && (fVar161 <= 1.0)) {
            auVar178._4_12_ = SUB1612(ZEXT816(0),0);
            auVar178._0_4_ = local_820._0_4_;
            auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar178);
            fVar165 = auVar66._0_4_;
            lVar57 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar54 * 8);
            if ((*(uint *)(lVar57 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) != 0
               ) {
              fVar165 = fVar165 * 1.5 + local_820._0_4_ * -0.5 * fVar165 * fVar165 * fVar165;
              auVar179._0_4_ = local_6c0._0_4_ * fVar165;
              auVar179._4_4_ = local_6c0._4_4_ * fVar165;
              auVar179._8_4_ = local_6c0._8_4_ * fVar165;
              auVar179._12_4_ = local_6c0._12_4_ * fVar165;
              auVar68 = vfmadd213ps_fma(auVar67,auVar179,auVar64);
              auVar66 = vshufps_avx(auVar179,auVar179,0xc9);
              auVar67 = vshufps_avx(auVar64,auVar64,0xc9);
              auVar180._0_4_ = auVar179._0_4_ * auVar67._0_4_;
              auVar180._4_4_ = auVar179._4_4_ * auVar67._4_4_;
              auVar180._8_4_ = auVar179._8_4_ * auVar67._8_4_;
              auVar180._12_4_ = auVar179._12_4_ * auVar67._12_4_;
              auVar64 = vfmsub231ps_fma(auVar180,auVar64,auVar66);
              auVar66 = vshufps_avx(auVar64,auVar64,0xc9);
              auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
              auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
              auVar135._0_4_ = auVar68._0_4_ * auVar64._0_4_;
              auVar135._4_4_ = auVar68._4_4_ * auVar64._4_4_;
              auVar135._8_4_ = auVar68._8_4_ * auVar64._8_4_;
              auVar135._12_4_ = auVar68._12_4_ * auVar64._12_4_;
              auVar66 = vfmsub231ps_fma(auVar135,auVar66,auVar67);
              fVar165 = auVar66._0_4_;
              if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar57 + 0x40) == 0)) {
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar146;
                fVar146 = (float)vextractps_avx(auVar66,1);
                pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar146;
                uVar131 = vextractps_avx(auVar66,2);
                *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar131;
                pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar165;
                pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar161;
                pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                pre[1].ray_space[1].vx.field_0.m128[(long)ray] = (float)local_788;
                pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar130;
                pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
              }
              else {
                local_440._0_16_ = vshufps_avx(auVar66,auVar66,0x55);
                local_440._16_16_ = vshufps_avx(auVar66,auVar66,0xaa);
                local_420 = fVar165;
                fStack_41c = fVar165;
                fStack_418 = fVar165;
                fStack_414 = fVar165;
                local_410 = fVar161;
                fStack_40c = fVar161;
                fStack_408 = fVar161;
                fStack_404 = fVar161;
                local_400 = ZEXT416(0) << 0x20;
                local_3f0 = local_460._0_8_;
                uStack_3e8 = local_460._8_8_;
                local_3e0 = local_450;
                vpcmpeqd_avx2(ZEXT1632(local_450),ZEXT1632(local_450));
                uStack_3cc = **(undefined4 **)(k + 8);
                local_3d0 = uStack_3cc;
                uStack_3c8 = uStack_3cc;
                uStack_3c4 = uStack_3cc;
                uStack_3c0 = (*(undefined4 **)(k + 8))[1];
                uStack_3bc = uStack_3c0;
                uStack_3b8 = uStack_3c0;
                uStack_3b4 = uStack_3c0;
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar146;
                local_870 = local_470;
                local_7c8 = local_870;
                local_7c0 = *(undefined8 *)(lVar57 + 0x18);
                local_7b8 = *(undefined8 *)(k + 8);
                local_7a8 = (int *)local_440;
                local_7a0 = 4;
                local_840._0_4_ = fVar163;
                local_7b0 = pre;
                if (*(code **)(lVar57 + 0x40) != (code *)0x0) {
                  auVar240 = ZEXT1664(auVar218);
                  (**(code **)(lVar57 + 0x40))(&local_7c8);
                  fVar163 = (float)local_840._0_4_;
                }
                uVar62 = vptestmd_avx512vl(local_870,local_870);
                if ((uVar62 & 0xf) != 0) {
                  pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                  if ((pcVar8 != (code *)0x0) &&
                     (((**(byte **)(k + 0x10) & 2) != 0 || ((*(byte *)(lVar57 + 0x3e) & 0x40) != 0))
                     )) {
                    auVar240 = ZEXT1664(auVar240._0_16_);
                    (*pcVar8)(&local_7c8);
                    fVar163 = (float)local_840._0_4_;
                  }
                  uVar62 = vptestmd_avx512vl(local_870,local_870);
                  uVar62 = uVar62 & 0xf;
                  bVar58 = (byte)uVar62;
                  if (bVar58 != 0) {
                    iVar3 = local_7a8[1];
                    iVar4 = local_7a8[2];
                    iVar1 = local_7a8[3];
                    pVVar5 = &local_7b0->ray_space[3].vz;
                    iVar46 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar58 & 1) * *local_7a8 |
                                (uint)!(bool)(bVar58 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0->ray_space[3].vz.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0->ray_space[3].vz.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0->ray_space[3].vz.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[5];
                    iVar4 = local_7a8[6];
                    iVar1 = local_7a8[7];
                    iVar46 = local_7b0[1].depth_scale.field_0.i[1];
                    iVar47 = local_7b0[1].depth_scale.field_0.i[2];
                    iVar48 = local_7b0[1].depth_scale.field_0.i[3];
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    local_7b0[1].depth_scale.field_0.i[0] =
                         (uint)(bVar58 & 1) * local_7a8[4] |
                         (uint)!(bool)(bVar58 & 1) * local_7b0[1].depth_scale.field_0.i[0];
                    local_7b0[1].depth_scale.field_0.i[1] =
                         (uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46;
                    local_7b0[1].depth_scale.field_0.i[2] =
                         (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47;
                    local_7b0[1].depth_scale.field_0.i[3] =
                         (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48;
                    iVar3 = local_7a8[9];
                    iVar4 = local_7a8[10];
                    iVar1 = local_7a8[0xb];
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    local_7b0[1].ray_space[0].vx.field_0.m128[0] =
                         (float)((uint)(bVar58 & 1) * local_7a8[8] |
                                (uint)!(bool)(bVar58 & 1) *
                                *(int *)&local_7b0[1].ray_space[0].vx.field_0);
                    local_7b0[1].ray_space[0].vx.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vx.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vx.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[0xd];
                    iVar4 = local_7a8[0xe];
                    iVar1 = local_7a8[0xf];
                    pVVar5 = &local_7b0[1].ray_space[0].vy;
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar58 & 1) * local_7a8[0xc] |
                                (uint)!(bool)(bVar58 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0[1].ray_space[0].vy.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vy.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vy.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[0x11];
                    iVar4 = local_7a8[0x12];
                    iVar1 = local_7a8[0x13];
                    pVVar5 = &local_7b0[1].ray_space[0].vz;
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar58 & 1) * local_7a8[0x10] |
                                (uint)!(bool)(bVar58 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0[1].ray_space[0].vz.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vz.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vz.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x14));
                    local_7b0[1].ray_space[1].vx.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x18));
                    local_7b0[1].ray_space[1].vy.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x1c));
                    local_7b0[1].ray_space[1].vz.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x20));
                    local_7b0[1].ray_space[2].vx.field_0 = aVar7;
                    goto LAB_01a09fd6;
                  }
                }
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar163;
              }
            }
          }
LAB_01a09fd6:
          uVar131 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
          auVar213._4_4_ = uVar131;
          auVar213._0_4_ = uVar131;
          auVar213._8_4_ = uVar131;
          auVar213._12_4_ = uVar131;
          auVar213._16_4_ = uVar131;
          auVar213._20_4_ = uVar131;
          auVar213._24_4_ = uVar131;
          auVar213._28_4_ = uVar131;
          auVar245 = ZEXT3264(auVar213);
          auVar49._4_4_ = fStack_35c;
          auVar49._0_4_ = local_360;
          auVar49._8_4_ = fStack_358;
          auVar49._12_4_ = fStack_354;
          auVar49._16_4_ = fStack_350;
          auVar49._20_4_ = fStack_34c;
          auVar49._24_4_ = fStack_348;
          auVar49._28_4_ = fStack_344;
          uVar16 = vcmpps_avx512vl(auVar213,auVar49,0xd);
          auVar222 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar241 = ZEXT3264(local_660);
          auVar242 = ZEXT3264(local_680);
        }
        auVar142._0_4_ = (float)local_640._0_4_ + (float)local_380._0_4_;
        auVar142._4_4_ = (float)local_640._4_4_ + (float)local_380._4_4_;
        auVar142._8_4_ = fStack_638 + fStack_378;
        auVar142._12_4_ = fStack_634 + fStack_374;
        auVar142._16_4_ = fStack_630 + fStack_370;
        auVar142._20_4_ = fStack_62c + fStack_36c;
        auVar142._24_4_ = fStack_628 + fStack_368;
        auVar142._28_4_ = fStack_624 + fStack_364;
        uVar131 = auVar245._0_4_;
        auVar159._4_4_ = uVar131;
        auVar159._0_4_ = uVar131;
        auVar159._8_4_ = uVar131;
        auVar159._12_4_ = uVar131;
        auVar159._16_4_ = uVar131;
        auVar159._20_4_ = uVar131;
        auVar159._24_4_ = uVar131;
        auVar159._28_4_ = uVar131;
        uVar16 = vcmpps_avx512vl(auVar142,auVar159,2);
        auVar143._8_4_ = 2;
        auVar143._0_8_ = 0x200000002;
        auVar143._12_4_ = 2;
        auVar143._16_4_ = 2;
        auVar143._20_4_ = 2;
        auVar143._24_4_ = 2;
        auVar143._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar143,auVar33);
        bVar59 = (bool)((byte)local_850 & 1);
        local_380._0_4_ = (uint)bVar59 * auVar77._0_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)((byte)(local_850 >> 1) & 1);
        local_380._4_4_ = (uint)bVar59 * auVar77._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)((byte)(local_850 >> 2) & 1);
        fStack_378 = (float)((uint)bVar59 * auVar77._8_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)((byte)(local_850 >> 3) & 1);
        fStack_374 = (float)((uint)bVar59 * auVar77._12_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)((byte)(local_850 >> 4) & 1);
        fStack_370 = (float)((uint)bVar59 * auVar77._16_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)((byte)(local_850 >> 5) & 1);
        fStack_36c = (float)((uint)bVar59 * auVar77._20_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)((byte)(local_850 >> 6) & 1);
        fStack_368 = (float)((uint)bVar59 * auVar77._24_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)((byte)(local_850 >> 7) & 1);
        fStack_364 = (float)((uint)bVar59 * auVar77._28_4_ | (uint)!bVar59 * 2);
        bVar52 = (byte)uVar18 & bVar52 & (byte)uVar16;
        uVar16 = vpcmpd_avx512vl(_local_380,local_320,2);
        local_3a0 = _local_2e0;
        local_360 = (float)local_640._0_4_ + (float)local_2e0._0_4_;
        fStack_35c = (float)local_640._4_4_ + (float)local_2e0._4_4_;
        fStack_358 = fStack_638 + fStack_2d8;
        fStack_354 = fStack_634 + fStack_2d4;
        fStack_350 = fStack_630 + fStack_2d0;
        fStack_34c = fStack_62c + fStack_2cc;
        fStack_348 = fStack_628 + fStack_2c8;
        fStack_344 = fStack_624 + fStack_2c4;
        auVar230 = ZEXT3264(local_740);
        auVar243 = ZEXT3264(local_760);
        auVar225 = ZEXT3264(local_720);
        auVar227 = ZEXT3264(local_780);
        for (bVar58 = (byte)uVar16 & bVar52; auVar77 = _local_800, bVar58 != 0;
            bVar58 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar58 & (byte)uVar16) {
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar74 = vblendmps_avx512vl(auVar144,local_3a0);
          auVar122._0_4_ =
               (uint)(bVar58 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 1 & 1);
          auVar122._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 2 & 1);
          auVar122._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 3 & 1);
          auVar122._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 4 & 1);
          auVar122._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 5 & 1);
          auVar122._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 0x7f800000;
          bVar59 = (bool)(bVar58 >> 6 & 1);
          auVar122._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 0x7f800000;
          auVar122._28_4_ =
               (uint)(bVar58 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar58 >> 7) * 0x7f800000;
          auVar74 = vshufps_avx(auVar122,auVar122,0xb1);
          auVar74 = vminps_avx(auVar122,auVar74);
          auVar75 = vshufpd_avx(auVar74,auVar74,5);
          auVar74 = vminps_avx(auVar74,auVar75);
          auVar75 = vpermpd_avx2(auVar74,0x4e);
          auVar74 = vminps_avx(auVar74,auVar75);
          uVar16 = vcmpps_avx512vl(auVar122,auVar74,0);
          bVar53 = (byte)uVar16 & bVar58;
          bVar56 = bVar58;
          if (bVar53 != 0) {
            bVar56 = bVar53;
          }
          iVar2 = 0;
          for (uVar63 = (uint)bVar56; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          fVar163 = local_844;
          fVar161 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
          uVar131 = 0;
          uVar228 = 0;
          uVar229 = 0;
          fVar146 = *(float *)(local_2c0 + (uint)(iVar2 << 2));
          uVar231 = 0;
          uVar232 = 0;
          uVar233 = 0;
          if ((float)local_6a0._0_4_ < 0.0) {
            local_820._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar2 << 2)));
            local_840._0_16_ = ZEXT416((uint)*(float *)(local_2c0 + (uint)(iVar2 << 2)));
            local_800[1] = 0;
            local_800[0] = bVar58;
            stack0xfffffffffffff802 = auVar77._2_30_;
            auVar240 = ZEXT1664(auVar240._0_16_);
            fVar163 = sqrtf((float)local_6a0._0_4_);
            bVar58 = local_800[0];
            auVar227 = ZEXT3264(local_780);
            auVar225 = ZEXT3264(local_720);
            auVar243 = ZEXT3264(local_760);
            auVar230 = ZEXT3264(local_740);
            fVar161 = (float)local_820._0_4_;
            uVar131 = local_820._4_4_;
            uVar228 = local_820._8_4_;
            uVar229 = local_820._12_4_;
            fVar146 = (float)local_840._0_4_;
            uVar231 = local_840._4_4_;
            uVar232 = local_840._8_4_;
            uVar233 = local_840._12_4_;
          }
          auVar67 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar66 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar64 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vminps_avx(auVar67,auVar64);
          auVar67 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar64 = vmaxps_avx(auVar66,auVar67);
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar68,auVar197);
          auVar67 = vandps_avx(auVar64,auVar197);
          auVar66 = vmaxps_avx(auVar66,auVar67);
          auVar67 = vmovshdup_avx(auVar66);
          auVar67 = vmaxss_avx(auVar67,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar67);
          fVar165 = auVar66._0_4_ * 1.9073486e-06;
          local_5e0 = vshufps_avx(auVar64,auVar64,0xff);
          lVar57 = 5;
          do {
            do {
              auVar74 = local_820;
              auVar77 = local_840;
              bVar59 = lVar57 == 0;
              lVar57 = lVar57 + -1;
              if (bVar59) goto LAB_01a0ac56;
              auVar136._4_4_ = fVar146;
              auVar136._0_4_ = fVar146;
              auVar136._8_4_ = fVar146;
              auVar136._12_4_ = fVar146;
              auVar67 = vfmadd132ps_fma(auVar136,ZEXT816(0) << 0x40,local_690);
              fVar132 = 1.0 - fVar161;
              auVar181._0_4_ = local_580._0_4_ * fVar161;
              auVar181._4_4_ = local_580._4_4_ * fVar161;
              auVar181._8_4_ = local_580._8_4_ * fVar161;
              auVar181._12_4_ = local_580._12_4_ * fVar161;
              local_4c0._0_16_ = ZEXT416((uint)fVar132);
              auVar198._4_4_ = fVar132;
              auVar198._0_4_ = fVar132;
              auVar198._8_4_ = fVar132;
              auVar198._12_4_ = fVar132;
              auVar66 = vfmadd231ps_fma(auVar181,auVar198,local_540._0_16_);
              auVar203._0_4_ = local_560._0_4_ * fVar161;
              auVar203._4_4_ = local_560._4_4_ * fVar161;
              auVar203._8_4_ = local_560._8_4_ * fVar161;
              auVar203._12_4_ = local_560._12_4_ * fVar161;
              auVar64 = vfmadd231ps_fma(auVar203,auVar198,local_580._0_16_);
              auVar211._0_4_ = fVar161 * (float)local_5a0._0_4_;
              auVar211._4_4_ = fVar161 * (float)local_5a0._4_4_;
              auVar211._8_4_ = fVar161 * fStack_598;
              auVar211._12_4_ = fVar161 * fStack_594;
              auVar68 = vfmadd231ps_fma(auVar211,auVar198,local_560._0_16_);
              auVar220._0_4_ = fVar161 * auVar64._0_4_;
              auVar220._4_4_ = fVar161 * auVar64._4_4_;
              auVar220._8_4_ = fVar161 * auVar64._8_4_;
              auVar220._12_4_ = fVar161 * auVar64._12_4_;
              auVar66 = vfmadd231ps_fma(auVar220,auVar198,auVar66);
              auVar182._0_4_ = fVar161 * auVar68._0_4_;
              auVar182._4_4_ = fVar161 * auVar68._4_4_;
              auVar182._8_4_ = fVar161 * auVar68._8_4_;
              auVar182._12_4_ = fVar161 * auVar68._12_4_;
              auVar64 = vfmadd231ps_fma(auVar182,auVar198,auVar64);
              auVar204._0_4_ = fVar161 * auVar64._0_4_;
              auVar204._4_4_ = fVar161 * auVar64._4_4_;
              auVar204._8_4_ = fVar161 * auVar64._8_4_;
              auVar204._12_4_ = fVar161 * auVar64._12_4_;
              auVar68 = vfmadd231ps_fma(auVar204,auVar66,auVar198);
              auVar66 = vsubps_avx(auVar64,auVar66);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar66,auVar25);
              _local_4a0 = auVar68;
              auVar66 = vsubps_avx(auVar67,auVar68);
              _local_800 = auVar66;
              auVar66 = vdpps_avx(auVar66,auVar66,0x7f);
              local_6e0._0_16_ = auVar66;
              local_820._4_4_ = uVar131;
              local_820._0_4_ = fVar161;
              local_820._8_4_ = uVar228;
              local_820._16_16_ = auVar74._16_16_;
              local_820._12_4_ = uVar229;
              local_840._4_4_ = uVar231;
              local_840._0_4_ = fVar146;
              local_840._8_4_ = uVar232;
              local_840._16_16_ = auVar77._16_16_;
              local_840._12_4_ = uVar233;
              local_6c0._0_16_ = auVar64;
              if (auVar66._0_4_ < 0.0) {
                auVar225._0_4_ = sqrtf(auVar66._0_4_);
                auVar225._4_60_ = extraout_var_01;
                auVar66 = auVar225._0_16_;
                auVar64 = local_6c0._0_16_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar66,auVar66);
              }
              local_4e0._0_16_ = vdpps_avx(auVar64,auVar64,0x7f);
              fVar146 = local_4e0._0_4_;
              auVar183._4_12_ = ZEXT812(0) << 0x20;
              auVar183._0_4_ = fVar146;
              local_700._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
              fVar161 = local_700._0_4_;
              local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_4e0._0_16_,auVar26);
              auVar67 = vfnmadd213ss_fma(local_500._0_16_,local_4e0._0_16_,ZEXT416(0x40000000));
              local_520._0_4_ = auVar67._0_4_;
              local_620._0_4_ = auVar66._0_4_;
              if (fVar146 < auVar68._0_4_) {
                fVar132 = sqrtf(fVar146);
                auVar66 = ZEXT416((uint)local_620._0_4_);
                auVar64 = local_6c0._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(local_4e0._0_16_,local_4e0._0_16_);
                fVar132 = auVar67._0_4_;
              }
              fVar194 = local_700._0_4_;
              fVar146 = fVar161 * 1.5 + fVar146 * -0.5 * fVar194 * fVar194 * fVar194;
              auVar239._0_4_ = auVar64._0_4_ * fVar146;
              auVar239._4_4_ = auVar64._4_4_ * fVar146;
              auVar239._8_4_ = auVar64._8_4_ * fVar146;
              auVar239._12_4_ = auVar64._12_4_ * fVar146;
              local_700._0_16_ = vdpps_avx(auVar239,_local_800,0x7f);
              auVar69 = vaddss_avx512f(auVar66,ZEXT416(0x3f800000));
              auVar137._0_4_ = local_700._0_4_ * local_700._0_4_;
              auVar137._4_4_ = local_700._4_4_ * local_700._4_4_;
              auVar137._8_4_ = local_700._8_4_ * local_700._8_4_;
              auVar137._12_4_ = local_700._12_4_ * local_700._12_4_;
              auVar67 = vsubps_avx(local_6e0._0_16_,auVar137);
              fVar161 = auVar67._0_4_;
              auVar153._4_12_ = ZEXT812(0) << 0x20;
              auVar153._0_4_ = fVar161;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar153);
              auVar70 = vmulss_avx512f(auVar68,ZEXT416(0x3fc00000));
              auVar71 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
              uVar61 = fVar161 == 0.0;
              uVar60 = fVar161 < 0.0;
              if ((bool)uVar60) {
                local_5d0 = fVar146;
                fStack_5cc = fVar146;
                fStack_5c8 = fVar146;
                fStack_5c4 = fVar146;
                local_5c0 = auVar239;
                local_5b0 = auVar68;
                fVar194 = sqrtf(fVar161);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar66 = ZEXT416((uint)local_620._0_4_);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar239 = local_5c0;
                auVar64 = local_6c0._0_16_;
                auVar68 = local_5b0;
                fVar146 = local_5d0;
                fVar161 = fStack_5cc;
                fVar168 = fStack_5c8;
                fVar170 = fStack_5c4;
              }
              else {
                auVar67 = vsqrtss_avx(auVar67,auVar67);
                fVar194 = auVar67._0_4_;
                fVar161 = fVar146;
                fVar168 = fVar146;
                fVar170 = fVar146;
              }
              auVar240 = ZEXT1664(auVar239);
              auVar230 = ZEXT3264(local_740);
              auVar243 = ZEXT3264(local_760);
              auVar227 = ZEXT3264(local_780);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,
                                        local_4c0._0_16_);
              fVar147 = auVar67._0_4_ * 6.0;
              fVar162 = local_820._0_4_ * 6.0;
              auVar184._0_4_ = fVar162 * (float)local_5a0._0_4_;
              auVar184._4_4_ = fVar162 * (float)local_5a0._4_4_;
              auVar184._8_4_ = fVar162 * fStack_598;
              auVar184._12_4_ = fVar162 * fStack_594;
              auVar154._4_4_ = fVar147;
              auVar154._0_4_ = fVar147;
              auVar154._8_4_ = fVar147;
              auVar154._12_4_ = fVar147;
              auVar67 = vfmadd132ps_fma(auVar154,auVar184,local_560._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,
                                        local_820._0_16_);
              fVar147 = auVar65._0_4_ * 6.0;
              auVar185._4_4_ = fVar147;
              auVar185._0_4_ = fVar147;
              auVar185._8_4_ = fVar147;
              auVar185._12_4_ = fVar147;
              auVar67 = vfmadd132ps_fma(auVar185,auVar67,local_580._0_16_);
              fVar147 = local_4c0._0_4_ * 6.0;
              auVar155._4_4_ = fVar147;
              auVar155._0_4_ = fVar147;
              auVar155._8_4_ = fVar147;
              auVar155._12_4_ = fVar147;
              auVar67 = vfmadd132ps_fma(auVar155,auVar67,local_540._0_16_);
              auVar186._0_4_ = auVar67._0_4_ * (float)local_4e0._0_4_;
              auVar186._4_4_ = auVar67._4_4_ * (float)local_4e0._0_4_;
              auVar186._8_4_ = auVar67._8_4_ * (float)local_4e0._0_4_;
              auVar186._12_4_ = auVar67._12_4_ * (float)local_4e0._0_4_;
              auVar67 = vdpps_avx(auVar64,auVar67,0x7f);
              fVar147 = auVar67._0_4_;
              auVar156._0_4_ = auVar64._0_4_ * fVar147;
              auVar156._4_4_ = auVar64._4_4_ * fVar147;
              auVar156._8_4_ = auVar64._8_4_ * fVar147;
              auVar156._12_4_ = auVar64._12_4_ * fVar147;
              auVar67 = vsubps_avx(auVar186,auVar156);
              fVar147 = (float)local_520._0_4_ * (float)local_500._0_4_;
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar64,auVar27);
              auVar205._0_4_ = fVar146 * auVar67._0_4_ * fVar147;
              auVar205._4_4_ = fVar161 * auVar67._4_4_ * fVar147;
              auVar205._8_4_ = fVar168 * auVar67._8_4_ * fVar147;
              auVar205._12_4_ = fVar170 * auVar67._12_4_ * fVar147;
              auVar67 = vdpps_avx(auVar72,auVar239,0x7f);
              auVar73 = vmaxss_avx(ZEXT416((uint)fVar165),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar163 * 1.9073486e-06))
                                  );
              auVar65 = vdpps_avx(_local_800,auVar205,0x7f);
              auVar66 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar165),auVar73);
              vfmadd213ss_avx512f(auVar69,ZEXT416((uint)(fVar165 / fVar132)),auVar66);
              auVar66 = vdpps_avx(local_690,auVar239,0x7f);
              fVar146 = auVar67._0_4_ + auVar65._0_4_;
              auVar67 = vdpps_avx(_local_800,auVar72,0x7f);
              auVar69 = vmulss_avx512f(auVar71,auVar68);
              auVar71 = vmulss_avx512f(auVar68,auVar68);
              auVar68 = vdpps_avx(_local_800,local_690,0x7f);
              auVar71 = vaddss_avx512f(auVar70,ZEXT416((uint)(auVar69._0_4_ * auVar71._0_4_)));
              auVar69 = vfnmadd231ss_fma(auVar67,local_700._0_16_,ZEXT416((uint)fVar146));
              auVar70 = vfnmadd231ss_fma(auVar68,local_700._0_16_,auVar66);
              auVar67 = vpermilps_avx(_local_4a0,0xff);
              fVar194 = fVar194 - auVar67._0_4_;
              auVar67 = vshufps_avx(auVar64,auVar64,0xff);
              auVar68 = vfmsub213ss_fma(auVar69,auVar71,auVar67);
              fVar161 = auVar70._0_4_ * auVar71._0_4_;
              auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar68._0_4_)),
                                        ZEXT416((uint)fVar146),ZEXT416((uint)fVar161));
              fVar132 = auVar69._0_4_;
              fVar161 = local_820._0_4_ -
                        (local_700._0_4_ * (fVar161 / fVar132) - fVar194 * (auVar66._0_4_ / fVar132)
                        );
              uVar131 = 0;
              uVar228 = 0;
              uVar229 = 0;
              fVar146 = (float)local_840._0_4_ -
                        (fVar194 * (fVar146 / fVar132) - local_700._0_4_ * (auVar68._0_4_ / fVar132)
                        );
              uVar231 = 0;
              uVar232 = 0;
              uVar233 = 0;
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar66 = vandps_avx512vl(local_700._0_16_,auVar28);
              auVar66 = vucomiss_avx512f(auVar66);
              auVar225 = ZEXT3264(local_720);
            } while ((bool)uVar60 || (bool)uVar61);
            auVar66 = vaddss_avx512f(auVar73,auVar66);
            auVar66 = vfmadd231ss_fma(auVar66,local_5e0,ZEXT416(0x36000000));
            auVar29._8_4_ = 0x7fffffff;
            auVar29._0_8_ = 0x7fffffff7fffffff;
            auVar29._12_4_ = 0x7fffffff;
            auVar68 = vandps_avx512vl(ZEXT416((uint)fVar194),auVar29);
          } while (auVar66._0_4_ <= auVar68._0_4_);
          fVar146 = fVar146 + (float)local_5f0._0_4_;
          if ((((fVar6 <= fVar146) &&
               (fVar163 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar146 <= fVar163)) &&
              (0.0 <= fVar161)) && (fVar161 <= 1.0)) {
            auVar187._4_12_ = SUB1612(ZEXT816(0),0);
            auVar187._0_4_ = local_6e0._0_4_;
            auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar187);
            fVar165 = auVar66._0_4_;
            lVar57 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar54 * 8);
            if ((*(uint *)(lVar57 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) != 0
               ) {
              fVar165 = fVar165 * 1.5 + (float)local_6e0._0_4_ * -0.5 * fVar165 * fVar165 * fVar165;
              auVar188._0_4_ = fVar165 * (float)local_800._0_4_;
              auVar188._4_4_ = fVar165 * (float)local_800._4_4_;
              auVar188._8_4_ = fVar165 * fStack_7f8;
              auVar188._12_4_ = fVar165 * fStack_7f4;
              auVar68 = vfmadd213ps_fma(auVar67,auVar188,auVar64);
              auVar66 = vshufps_avx(auVar188,auVar188,0xc9);
              auVar67 = vshufps_avx(auVar64,auVar64,0xc9);
              auVar189._0_4_ = auVar188._0_4_ * auVar67._0_4_;
              auVar189._4_4_ = auVar188._4_4_ * auVar67._4_4_;
              auVar189._8_4_ = auVar188._8_4_ * auVar67._8_4_;
              auVar189._12_4_ = auVar188._12_4_ * auVar67._12_4_;
              auVar64 = vfmsub231ps_fma(auVar189,auVar64,auVar66);
              auVar66 = vshufps_avx(auVar64,auVar64,0xc9);
              auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
              auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
              auVar138._0_4_ = auVar68._0_4_ * auVar64._0_4_;
              auVar138._4_4_ = auVar68._4_4_ * auVar64._4_4_;
              auVar138._8_4_ = auVar68._8_4_ * auVar64._8_4_;
              auVar138._12_4_ = auVar68._12_4_ * auVar64._12_4_;
              auVar66 = vfmsub231ps_fma(auVar138,auVar66,auVar67);
              fVar165 = auVar66._0_4_;
              if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar57 + 0x40) == 0)) {
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar146;
                fVar146 = (float)vextractps_avx(auVar66,1);
                pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar146;
                uVar131 = vextractps_avx(auVar66,2);
                *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar131;
                pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar165;
                pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar161;
                pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                pre[1].ray_space[1].vx.field_0.m128[(long)ray] = (float)local_788;
                pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar130;
                pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
              }
              else {
                local_440._0_16_ = vshufps_avx(auVar66,auVar66,0x55);
                local_440._16_16_ = vshufps_avx(auVar66,auVar66,0xaa);
                local_420 = fVar165;
                fStack_41c = fVar165;
                fStack_418 = fVar165;
                fStack_414 = fVar165;
                local_410 = fVar161;
                fStack_40c = fVar161;
                fStack_408 = fVar161;
                fStack_404 = fVar161;
                local_400 = ZEXT416(0) << 0x20;
                local_3f0 = local_460._0_8_;
                uStack_3e8 = local_460._8_8_;
                local_3e0 = local_450;
                vpcmpeqd_avx2(ZEXT1632(local_450),ZEXT1632(local_450));
                uStack_3cc = **(undefined4 **)(k + 8);
                local_3d0 = uStack_3cc;
                uStack_3c8 = uStack_3cc;
                uStack_3c4 = uStack_3cc;
                uStack_3c0 = (*(undefined4 **)(k + 8))[1];
                uStack_3bc = uStack_3c0;
                uStack_3b8 = uStack_3c0;
                uStack_3b4 = uStack_3c0;
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar146;
                local_870 = local_470;
                local_7c8 = local_870;
                local_7c0 = *(undefined8 *)(lVar57 + 0x18);
                local_7b8 = *(undefined8 *)(k + 8);
                local_7a8 = (int *)local_440;
                local_7a0 = 4;
                local_820._0_4_ = fVar163;
                local_7b0 = pre;
                if (*(code **)(lVar57 + 0x40) != (code *)0x0) {
                  auVar240 = ZEXT1664(auVar239);
                  (**(code **)(lVar57 + 0x40))(&local_7c8);
                  auVar227 = ZEXT3264(local_780);
                  auVar225 = ZEXT3264(local_720);
                  auVar243 = ZEXT3264(local_760);
                  auVar230 = ZEXT3264(local_740);
                  fVar163 = (float)local_820._0_4_;
                }
                uVar62 = vptestmd_avx512vl(local_870,local_870);
                if ((uVar62 & 0xf) != 0) {
                  pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                  if ((pcVar8 != (code *)0x0) &&
                     (((**(byte **)(k + 0x10) & 2) != 0 || ((*(byte *)(lVar57 + 0x3e) & 0x40) != 0))
                     )) {
                    auVar240 = ZEXT1664(auVar240._0_16_);
                    (*pcVar8)(&local_7c8);
                    auVar227 = ZEXT3264(local_780);
                    auVar225 = ZEXT3264(local_720);
                    auVar243 = ZEXT3264(local_760);
                    auVar230 = ZEXT3264(local_740);
                    fVar163 = (float)local_820._0_4_;
                  }
                  uVar62 = vptestmd_avx512vl(local_870,local_870);
                  uVar62 = uVar62 & 0xf;
                  bVar56 = (byte)uVar62;
                  if (bVar56 != 0) {
                    iVar3 = local_7a8[1];
                    iVar4 = local_7a8[2];
                    iVar1 = local_7a8[3];
                    pVVar5 = &local_7b0->ray_space[3].vz;
                    iVar46 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0->ray_space[3].vz.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar56 & 1) * *local_7a8 |
                                (uint)!(bool)(bVar56 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0->ray_space[3].vz.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0->ray_space[3].vz.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0->ray_space[3].vz.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[5];
                    iVar4 = local_7a8[6];
                    iVar1 = local_7a8[7];
                    iVar46 = local_7b0[1].depth_scale.field_0.i[1];
                    iVar47 = local_7b0[1].depth_scale.field_0.i[2];
                    iVar48 = local_7b0[1].depth_scale.field_0.i[3];
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    local_7b0[1].depth_scale.field_0.i[0] =
                         (uint)(bVar56 & 1) * local_7a8[4] |
                         (uint)!(bool)(bVar56 & 1) * local_7b0[1].depth_scale.field_0.i[0];
                    local_7b0[1].depth_scale.field_0.i[1] =
                         (uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46;
                    local_7b0[1].depth_scale.field_0.i[2] =
                         (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47;
                    local_7b0[1].depth_scale.field_0.i[3] =
                         (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48;
                    iVar3 = local_7a8[9];
                    iVar4 = local_7a8[10];
                    iVar1 = local_7a8[0xb];
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vx.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    local_7b0[1].ray_space[0].vx.field_0.m128[0] =
                         (float)((uint)(bVar56 & 1) * local_7a8[8] |
                                (uint)!(bool)(bVar56 & 1) *
                                *(int *)&local_7b0[1].ray_space[0].vx.field_0);
                    local_7b0[1].ray_space[0].vx.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vx.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vx.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[0xd];
                    iVar4 = local_7a8[0xe];
                    iVar1 = local_7a8[0xf];
                    pVVar5 = &local_7b0[1].ray_space[0].vy;
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vy.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar56 & 1) * local_7a8[0xc] |
                                (uint)!(bool)(bVar56 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0[1].ray_space[0].vy.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vy.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vy.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    iVar3 = local_7a8[0x11];
                    iVar4 = local_7a8[0x12];
                    iVar1 = local_7a8[0x13];
                    pVVar5 = &local_7b0[1].ray_space[0].vz;
                    iVar46 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 4);
                    iVar47 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 8);
                    iVar48 = *(int *)((long)&local_7b0[1].ray_space[0].vz.field_0 + 0xc);
                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar10 = SUB81(uVar62 >> 3,0);
                    (pVVar5->field_0).m128[0] =
                         (float)((uint)(bVar56 & 1) * local_7a8[0x10] |
                                (uint)!(bool)(bVar56 & 1) * *(int *)&pVVar5->field_0);
                    local_7b0[1].ray_space[0].vz.field_0.m128[1] =
                         (float)((uint)bVar59 * iVar3 | (uint)!bVar59 * iVar46);
                    local_7b0[1].ray_space[0].vz.field_0.m128[2] =
                         (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar47);
                    local_7b0[1].ray_space[0].vz.field_0.m128[3] =
                         (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar48);
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x14));
                    local_7b0[1].ray_space[1].vx.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x18));
                    local_7b0[1].ray_space[1].vy.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x1c));
                    local_7b0[1].ray_space[1].vz.field_0 = aVar7;
                    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                            vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7a8 + 0x20));
                    local_7b0[1].ray_space[2].vx.field_0 = aVar7;
                    goto LAB_01a0ac56;
                  }
                }
                pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar163;
              }
            }
          }
LAB_01a0ac56:
          uVar131 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
          auVar214._4_4_ = uVar131;
          auVar214._0_4_ = uVar131;
          auVar214._8_4_ = uVar131;
          auVar214._12_4_ = uVar131;
          auVar214._16_4_ = uVar131;
          auVar214._20_4_ = uVar131;
          auVar214._24_4_ = uVar131;
          auVar214._28_4_ = uVar131;
          auVar245 = ZEXT3264(auVar214);
          auVar50._4_4_ = fStack_35c;
          auVar50._0_4_ = local_360;
          auVar50._8_4_ = fStack_358;
          auVar50._12_4_ = fStack_354;
          auVar50._16_4_ = fStack_350;
          auVar50._20_4_ = fStack_34c;
          auVar50._24_4_ = fStack_348;
          auVar50._28_4_ = fStack_344;
          uVar16 = vcmpps_avx512vl(auVar214,auVar50,0xd);
          auVar222 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar241 = ZEXT3264(local_660);
          auVar242 = ZEXT3264(local_680);
        }
        uVar19 = vpcmpd_avx512vl(local_320,local_2a0,1);
        uVar18 = vpcmpd_avx512vl(local_320,_local_380,1);
        auVar160._0_4_ = (float)local_640._0_4_ + (float)local_200._0_4_;
        auVar160._4_4_ = (float)local_640._4_4_ + (float)local_200._4_4_;
        auVar160._8_4_ = fStack_638 + fStack_1f8;
        auVar160._12_4_ = fStack_634 + fStack_1f4;
        auVar160._16_4_ = fStack_630 + fStack_1f0;
        auVar160._20_4_ = fStack_62c + fStack_1ec;
        auVar160._24_4_ = fStack_628 + fStack_1e8;
        auVar160._28_4_ = fStack_624 + fStack_1e4;
        uVar131 = auVar245._0_4_;
        auVar193._4_4_ = uVar131;
        auVar193._0_4_ = uVar131;
        auVar193._8_4_ = uVar131;
        auVar193._12_4_ = uVar131;
        auVar193._16_4_ = uVar131;
        auVar193._20_4_ = uVar131;
        auVar193._24_4_ = uVar131;
        auVar193._28_4_ = uVar131;
        uVar16 = vcmpps_avx512vl(auVar160,auVar193,2);
        bVar58 = (byte)local_84c & (byte)uVar19 & (byte)uVar16;
        auVar199._0_4_ = (float)local_640._0_4_ + (float)local_2e0._0_4_;
        auVar199._4_4_ = (float)local_640._4_4_ + (float)local_2e0._4_4_;
        auVar199._8_4_ = fStack_638 + fStack_2d8;
        auVar199._12_4_ = fStack_634 + fStack_2d4;
        auVar199._16_4_ = fStack_630 + fStack_2d0;
        auVar199._20_4_ = fStack_62c + fStack_2cc;
        auVar199._24_4_ = fStack_628 + fStack_2c8;
        auVar199._28_4_ = fStack_624 + fStack_2c4;
        uVar16 = vcmpps_avx512vl(auVar199,auVar193,2);
        bVar52 = bVar52 & (byte)uVar18 & (byte)uVar16 | bVar58;
        if (bVar52 != 0) {
          abStack_180[uVar55 * 0x60] = bVar52;
          bVar59 = (bool)(bVar58 >> 1 & 1);
          bVar9 = (bool)(bVar58 >> 2 & 1);
          bVar10 = (bool)(bVar58 >> 3 & 1);
          bVar11 = (bool)(bVar58 >> 4 & 1);
          bVar12 = (bool)(bVar58 >> 5 & 1);
          bVar13 = (bool)(bVar58 >> 6 & 1);
          auStack_160[uVar55 * 0x18] =
               (uint)(bVar58 & 1) * local_200._0_4_ | (uint)!(bool)(bVar58 & 1) * local_2e0._0_4_;
          auStack_160[uVar55 * 0x18 + 1] =
               (uint)bVar59 * local_200._4_4_ | (uint)!bVar59 * local_2e0._4_4_;
          auStack_160[uVar55 * 0x18 + 2] =
               (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)fStack_2d8;
          auStack_160[uVar55 * 0x18 + 3] =
               (uint)bVar10 * (int)fStack_1f4 | (uint)!bVar10 * (int)fStack_2d4;
          auStack_160[uVar55 * 0x18 + 4] =
               (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)fStack_2d0;
          auStack_160[uVar55 * 0x18 + 5] =
               (uint)bVar12 * (int)fStack_1ec | (uint)!bVar12 * (int)fStack_2cc;
          auStack_160[uVar55 * 0x18 + 6] =
               (uint)bVar13 * (int)fStack_1e8 | (uint)!bVar13 * (int)fStack_2c8;
          auStack_160[uVar55 * 0x18 + 7] =
               (uint)(bVar58 >> 7) * (int)fStack_1e4 | (uint)!(bool)(bVar58 >> 7) * (int)fStack_2c4;
          uVar62 = vmovlps_avx(local_330);
          (&uStack_140)[uVar55 * 0xc] = uVar62;
          aiStack_138[uVar55 * 0x18] = local_854 + 1;
          uVar55 = (ulong)((int)uVar55 + 1);
        }
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar245 = ZEXT3264(auVar77);
        context = local_798;
        fVar146 = (float)local_640._0_4_;
        fVar161 = (float)local_640._4_4_;
        fVar163 = fStack_638;
        fVar165 = fStack_634;
        fVar132 = fStack_630;
        fVar194 = fStack_62c;
        fVar168 = fStack_628;
        fVar170 = fStack_624;
      }
    }
    do {
      uVar63 = (uint)uVar55;
      uVar55 = (ulong)(uVar63 - 1);
      if (uVar63 == 0) {
        uVar131 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
        auVar35._4_4_ = uVar131;
        auVar35._0_4_ = uVar131;
        auVar35._8_4_ = uVar131;
        auVar35._12_4_ = uVar131;
        auVar35._16_4_ = uVar131;
        auVar35._20_4_ = uVar131;
        auVar35._24_4_ = uVar131;
        auVar35._28_4_ = uVar131;
        uVar16 = vcmpps_avx512vl(local_280,auVar35,2);
        local_790 = (ulong)((uint)uVar16 & (uint)local_790 - 1 & (uint)local_790);
        goto LAB_01a0878c;
      }
      auVar77 = *(undefined1 (*) [32])(auStack_160 + uVar55 * 0x18);
      auVar157._0_4_ = fVar146 + auVar77._0_4_;
      auVar157._4_4_ = fVar161 + auVar77._4_4_;
      auVar157._8_4_ = fVar163 + auVar77._8_4_;
      auVar157._12_4_ = fVar165 + auVar77._12_4_;
      auVar157._16_4_ = fVar132 + auVar77._16_4_;
      auVar157._20_4_ = fVar194 + auVar77._20_4_;
      auVar157._24_4_ = fVar168 + auVar77._24_4_;
      auVar157._28_4_ = fVar170 + auVar77._28_4_;
      uVar131 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
      auVar34._4_4_ = uVar131;
      auVar34._0_4_ = uVar131;
      auVar34._8_4_ = uVar131;
      auVar34._12_4_ = uVar131;
      auVar34._16_4_ = uVar131;
      auVar34._20_4_ = uVar131;
      auVar34._24_4_ = uVar131;
      auVar34._28_4_ = uVar131;
      uVar16 = vcmpps_avx512vl(auVar157,auVar34,2);
      uVar123 = (uint)uVar16 & (uint)abStack_180[uVar55 * 0x60];
    } while (uVar123 == 0);
    uVar62 = (&uStack_140)[uVar55 * 0xc];
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar62;
    auVar192._8_4_ = 0x7f800000;
    auVar192._0_8_ = 0x7f8000007f800000;
    auVar192._12_4_ = 0x7f800000;
    auVar192._16_4_ = 0x7f800000;
    auVar192._20_4_ = 0x7f800000;
    auVar192._24_4_ = 0x7f800000;
    auVar192._28_4_ = 0x7f800000;
    auVar74 = vblendmps_avx512vl(auVar192,auVar77);
    bVar52 = (byte)uVar123;
    auVar120._0_4_ =
         (uint)(bVar52 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar77._0_4_;
    bVar59 = (bool)((byte)(uVar123 >> 1) & 1);
    auVar120._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * (int)auVar77._4_4_;
    bVar59 = (bool)((byte)(uVar123 >> 2) & 1);
    auVar120._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * (int)auVar77._8_4_;
    bVar59 = (bool)((byte)(uVar123 >> 3) & 1);
    auVar120._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * (int)auVar77._12_4_;
    bVar59 = (bool)((byte)(uVar123 >> 4) & 1);
    auVar120._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * (int)auVar77._16_4_;
    bVar59 = (bool)((byte)(uVar123 >> 5) & 1);
    auVar120._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * (int)auVar77._20_4_;
    bVar59 = (bool)((byte)(uVar123 >> 6) & 1);
    auVar120._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * (int)auVar77._24_4_;
    auVar120._28_4_ =
         (uVar123 >> 7) * auVar74._28_4_ | (uint)!SUB41(uVar123 >> 7,0) * (int)auVar77._28_4_;
    auVar77 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar77 = vminps_avx(auVar120,auVar77);
    auVar74 = vshufpd_avx(auVar77,auVar77,5);
    auVar77 = vminps_avx(auVar77,auVar74);
    auVar74 = vpermpd_avx2(auVar77,0x4e);
    auVar77 = vminps_avx(auVar77,auVar74);
    uVar16 = vcmpps_avx512vl(auVar120,auVar77,0);
    bVar58 = (byte)uVar16 & bVar52;
    if (bVar58 != 0) {
      uVar123 = (uint)bVar58;
    }
    uVar124 = 0;
    for (; (uVar123 & 1) == 0; uVar123 = uVar123 >> 1 | 0x80000000) {
      uVar124 = uVar124 + 1;
    }
    local_854 = aiStack_138[uVar55 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar124 & 0x1f)) & bVar52;
    abStack_180[uVar55 * 0x60] = bVar52;
    if (bVar52 == 0) {
      uVar63 = uVar63 - 1;
    }
    uVar131 = (undefined4)uVar62;
    auVar139._4_4_ = uVar131;
    auVar139._0_4_ = uVar131;
    auVar139._8_4_ = uVar131;
    auVar139._12_4_ = uVar131;
    auVar139._16_4_ = uVar131;
    auVar139._20_4_ = uVar131;
    auVar139._24_4_ = uVar131;
    auVar139._28_4_ = uVar131;
    auVar66 = vmovshdup_avx(auVar148);
    auVar66 = vsubps_avx(auVar66,auVar148);
    auVar158._0_4_ = auVar66._0_4_;
    auVar158._4_4_ = auVar158._0_4_;
    auVar158._8_4_ = auVar158._0_4_;
    auVar158._12_4_ = auVar158._0_4_;
    auVar158._16_4_ = auVar158._0_4_;
    auVar158._20_4_ = auVar158._0_4_;
    auVar158._24_4_ = auVar158._0_4_;
    auVar158._28_4_ = auVar158._0_4_;
    auVar66 = vfmadd132ps_fma(auVar158,auVar139,_DAT_01f7b040);
    local_440 = ZEXT1632(auVar66);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_440 + (ulong)uVar124 * 4);
    uVar55 = (ulong)uVar63;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }